

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void __thiscall
embree::sse42::
BVHNIntersector1<4,_16777232,_true,_embree::sse42::SubGridMBIntersector1Pluecker<4,_true>_>::
intersect(BVHNIntersector1<4,_16777232,_true,_embree::sse42::SubGridMBIntersector1Pluecker<4,_true>_>
          *this,Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  undefined8 *puVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  Scene **ppSVar7;
  Scene **ppSVar8;
  Scene **ppSVar9;
  Scene **ppSVar10;
  Scene **ppSVar11;
  Scene **ppSVar12;
  Scene **ppSVar13;
  Intersector1 *pIVar14;
  float *pfVar15;
  float *pfVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  Collider CVar21;
  ushort uVar22;
  ushort uVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  byte *pbVar28;
  uint *puVar29;
  Scene *pSVar30;
  code *pcVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  byte bVar36;
  byte bVar37;
  byte bVar38;
  byte bVar39;
  byte bVar40;
  byte bVar41;
  byte bVar42;
  byte bVar43;
  undefined1 auVar44 [16];
  byte bVar45;
  undefined1 (*pauVar46) [16];
  RayHit *pRVar47;
  Intersectors *pIVar48;
  AABBNodeMB4D *node1;
  ulong uVar49;
  long lVar50;
  long lVar51;
  undefined8 uVar52;
  Intersectors *pIVar53;
  uint uVar54;
  undefined4 uVar55;
  long lVar56;
  RayQueryContext *pRVar57;
  long lVar58;
  ulong uVar59;
  ulong uVar60;
  long lVar61;
  undefined1 (*pauVar62) [16];
  ulong uVar63;
  undefined4 *puVar64;
  long lVar65;
  ulong uVar66;
  long lVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  byte bVar71;
  byte bVar95;
  byte bVar96;
  byte bVar97;
  byte bVar98;
  byte bVar99;
  byte bVar100;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar101;
  float fVar102;
  uint uVar122;
  uint uVar123;
  vint4 ai;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  uint uVar124;
  float fVar125;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar126;
  uint uVar127;
  uint uVar139;
  uint uVar140;
  vint4 ai_2;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  uint uVar141;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  uint uVar142;
  uint uVar155;
  uint uVar156;
  vint4 bi;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  uint uVar157;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  vint4 ai_5;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar170;
  float fVar171;
  vint4 ai_1;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  float fVar172;
  uint uVar173;
  float fVar178;
  uint uVar180;
  vint4 bi_1;
  undefined1 auVar174 [16];
  uint uVar179;
  uint uVar181;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  float fVar182;
  float fVar183;
  float fVar190;
  float fVar192;
  vint4 ai_7;
  undefined1 auVar184 [16];
  float fVar191;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  float fVar193;
  float fVar194;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar211;
  float fVar212;
  float fVar214;
  float fVar215;
  float fVar216;
  undefined1 auVar199 [16];
  float fVar210;
  float fVar213;
  float fVar217;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  float fVar218;
  float fVar222;
  float fVar223;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  float fVar224;
  float fVar226;
  float fVar227;
  undefined1 auVar225 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  vint4 bi_4;
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  UVIdentity<4> mapUV;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  vfloat<4> dist;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1489;
  undefined1 local_1488 [8];
  float fStack_1480;
  float fStack_147c;
  undefined1 local_1478 [8];
  float fStack_1470;
  float fStack_146c;
  undefined1 local_1464 [32];
  float fStack_1444;
  float fStack_1440;
  float fStack_143c;
  undefined4 local_1438;
  float fStack_1434;
  float fStack_1430;
  float fStack_142c;
  float local_1428;
  float fStack_1424;
  float fStack_1420;
  float fStack_141c;
  float local_1418;
  float fStack_1414;
  float fStack_1410;
  float fStack_140c;
  undefined1 local_1408 [16];
  RayHit *local_13f0;
  Intersectors *local_13e8 [2];
  undefined4 *local_13d8;
  Intersectors *local_13d0;
  float *local_13c8;
  undefined4 local_13c0;
  undefined8 local_13b8;
  float fStack_13b0;
  float fStack_13ac;
  undefined8 local_13a8;
  float fStack_13a0;
  float fStack_139c;
  float local_1398;
  float fStack_1394;
  float fStack_1390;
  float fStack_138c;
  float local_1388;
  float fStack_1384;
  float fStack_1380;
  float fStack_137c;
  float local_1378;
  float fStack_1374;
  float fStack_1370;
  float fStack_136c;
  float local_1368;
  undefined4 local_1364;
  undefined4 local_1360;
  undefined4 local_135c;
  undefined4 local_1358;
  undefined4 local_1354;
  undefined4 local_1350;
  undefined4 local_134c;
  undefined4 local_1348;
  RayQueryContext *local_1330;
  float local_1328;
  float fStack_1324;
  float fStack_1320;
  float fStack_131c;
  float local_1318;
  float fStack_1314;
  float fStack_1310;
  float fStack_130c;
  float local_1308;
  float fStack_1304;
  float fStack_1300;
  float fStack_12fc;
  undefined1 local_12f8 [8];
  float fStack_12f0;
  float fStack_12ec;
  undefined1 local_12e8 [8];
  float fStack_12e0;
  float fStack_12dc;
  undefined1 local_12d8 [16];
  undefined1 local_12c8 [16];
  float local_12b8;
  float fStack_12b4;
  float fStack_12b0;
  float fStack_12ac;
  float local_12a8;
  float fStack_12a4;
  float fStack_12a0;
  float fStack_129c;
  undefined1 local_1298 [8];
  float fStack_1290;
  float fStack_128c;
  float local_1288;
  float fStack_1284;
  float fStack_1280;
  float fStack_127c;
  undefined1 local_1278 [16];
  undefined1 *local_1268;
  undefined1 local_1258 [16];
  undefined1 local_1248 [16];
  undefined1 local_1238 [16];
  undefined1 local_1228 [16];
  undefined1 local_1218 [16];
  undefined1 local_1208 [16];
  undefined1 local_11f8 [16];
  float local_11e8;
  float fStack_11e4;
  float fStack_11e0;
  float fStack_11dc;
  long local_11d8;
  long local_11d0;
  ulong local_11c8;
  ulong local_11c0;
  ulong local_11b8;
  Intersectors *local_11b0;
  undefined1 (*local_11a8) [16];
  long local_11a0;
  long local_1198;
  ulong local_1190;
  ulong local_1188;
  ulong local_1180;
  float local_1178;
  float fStack_1174;
  float fStack_1170;
  float fStack_116c;
  float local_1168;
  float fStack_1164;
  float fStack_1160;
  float fStack_115c;
  float local_1158;
  float fStack_1154;
  float fStack_1150;
  float fStack_114c;
  float local_1148;
  float fStack_1144;
  float fStack_1140;
  float fStack_113c;
  undefined1 local_1138 [16];
  uint local_1128;
  uint uStack_1124;
  uint uStack_1120;
  uint uStack_111c;
  float local_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float local_1108;
  float fStack_1104;
  float fStack_1100;
  float fStack_10fc;
  float local_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  float local_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  undefined1 local_10c8 [8];
  float fStack_10c0;
  float fStack_10bc;
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  undefined8 local_1088;
  float fStack_1080;
  float fStack_107c;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  undefined8 local_1058;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  undefined1 local_1018 [16];
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  undefined1 local_f98 [16];
  float local_f88;
  uint uStack_f84;
  uint uStack_f80;
  uint uStack_f7c;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  if (*(long *)(*(long *)this + 0x70) != 8) {
    pauVar62 = (undefined1 (*) [16])local_f68;
    local_f78 = *(long *)(*(long *)this + 0x70);
    uStack_f70 = 0;
    uVar55 = *(undefined4 *)&This->ptr;
    uVar17 = *(undefined4 *)((long)&This->ptr + 4);
    uVar18 = *(undefined4 *)&This->leafIntersector;
    fVar215 = *(float *)((long)&This->leafIntersector + 4);
    CVar21 = This->collider;
    fVar102 = 0.0;
    if (0.0 <= fVar215) {
      fVar102 = fVar215;
    }
    fVar215 = *(float *)&(This->intersector1).intersect;
    local_1038 = 0.0;
    if (0.0 <= fVar215) {
      local_1038 = fVar215;
    }
    auVar128._4_4_ = -(uint)(ABS(CVar21.collide._4_4_) < 1e-18);
    auVar128._0_4_ = -(uint)(ABS(CVar21.collide._0_4_) < 1e-18);
    auVar128._8_4_ = -(uint)(ABS(CVar21.name._0_4_) < 1e-18);
    auVar128._12_4_ = -(uint)(ABS(CVar21.name._4_4_) < 1e-18);
    auVar219 = divps(_DAT_01f46a60,(undefined1  [16])CVar21);
    auVar219 = blendvps(auVar219,_DAT_01f76a70,auVar128);
    fVar224 = auVar219._0_4_ * 0.99999964;
    fVar226 = auVar219._4_4_ * 0.99999964;
    fVar227 = auVar219._8_4_ * 0.99999964;
    fVar218 = auVar219._0_4_ * 1.0000004;
    fVar222 = auVar219._4_4_ * 1.0000004;
    fVar223 = auVar219._8_4_ * 1.0000004;
    auVar176._4_4_ = uVar55;
    auVar176._0_4_ = uVar55;
    auVar176._8_4_ = uVar55;
    auVar176._12_4_ = uVar55;
    auVar232._4_4_ = uVar17;
    auVar232._0_4_ = uVar17;
    auVar232._8_4_ = uVar17;
    auVar232._12_4_ = uVar17;
    auVar113._4_4_ = uVar18;
    auVar113._0_4_ = uVar18;
    auVar113._8_4_ = uVar18;
    auVar113._12_4_ = uVar18;
    local_10c8._4_4_ = fVar222;
    local_10c8._0_4_ = fVar222;
    fStack_10c0 = fVar222;
    fStack_10bc = fVar222;
    uVar60 = (ulong)(fVar224 < 0.0) << 4;
    uVar63 = (ulong)(fVar226 < 0.0) << 4 | 0x20;
    uVar59 = (ulong)(fVar227 < 0.0) << 4 | 0x40;
    local_1180 = uVar60 ^ 0x10;
    local_1188 = uVar63 ^ 0x10;
    local_1190 = uVar59 ^ 0x10;
    auVar219._4_4_ = fVar102;
    auVar219._0_4_ = fVar102;
    auVar219._8_4_ = fVar102;
    auVar219._12_4_ = fVar102;
    _local_1128 = mm_lookupmask_ps._240_8_;
    _uStack_1120 = mm_lookupmask_ps._248_8_;
    local_11e8 = fVar218;
    fStack_11e4 = fVar218;
    fStack_11e0 = fVar218;
    fStack_11dc = fVar218;
    local_13f0 = ray;
    local_11b0 = This;
    local_1098 = auVar113;
    local_1138 = auVar219;
    local_1148 = fVar223;
    fStack_1144 = fVar223;
    fStack_1140 = fVar223;
    fStack_113c = fVar223;
    local_1158 = fVar227;
    fStack_1154 = fVar227;
    fStack_1150 = fVar227;
    fStack_114c = fVar227;
    local_10a8 = auVar176;
    local_10b8 = auVar232;
    local_11b8 = uVar60;
    local_1168 = fVar224;
    fStack_1164 = fVar224;
    fStack_1160 = fVar224;
    fStack_115c = fVar224;
    local_1178 = fVar226;
    fStack_1174 = fVar226;
    fStack_1170 = fVar226;
    fStack_116c = fVar226;
    local_11c0 = uVar63;
    local_11c8 = uVar59;
    fStack_1034 = local_1038;
    fVar102 = local_1038;
    fVar222 = local_1038;
    fVar217 = fVar218;
    fVar101 = fVar218;
    fVar172 = fVar218;
    fVar178 = fVar223;
    fVar193 = fVar223;
    fVar194 = fVar223;
    fVar125 = fVar227;
    fVar195 = fVar227;
    fVar207 = fVar227;
    fVar126 = fVar224;
    fVar182 = fVar224;
    fVar190 = fVar224;
    fVar214 = fVar226;
    fVar170 = fVar226;
    fVar171 = fVar226;
LAB_006b408e:
    if (pauVar62 != (undefined1 (*) [16])&local_f78) {
      pauVar46 = pauVar62 + -1;
      pauVar62 = pauVar62 + -1;
      if (*(float *)((long)*pauVar46 + 8) <= fVar215) {
        uVar66 = *(ulong *)*pauVar62;
        while ((uVar66 & 8) == 0) {
          fVar183 = *(float *)((long)&(This->collider).name + 4);
          fVar215 = *(float *)&(This->intersector1).intersect;
          uVar49 = uVar66 & 0xfffffffffffffff0;
          pfVar16 = (float *)(uVar49 + 0x80 + uVar60);
          pfVar15 = (float *)(uVar49 + 0x20 + uVar60);
          auVar145._0_4_ = ((*pfVar16 * fVar183 + *pfVar15) - auVar176._0_4_) * fVar224;
          auVar145._4_4_ = ((pfVar16[1] * fVar183 + pfVar15[1]) - auVar176._4_4_) * fVar126;
          auVar145._8_4_ = ((pfVar16[2] * fVar183 + pfVar15[2]) - auVar176._8_4_) * fVar182;
          auVar145._12_4_ = ((pfVar16[3] * fVar183 + pfVar15[3]) - auVar176._12_4_) * fVar190;
          pfVar16 = (float *)(uVar49 + 0x80 + uVar63);
          pfVar15 = (float *)(uVar49 + 0x20 + uVar63);
          auVar158._0_4_ = ((*pfVar16 * fVar183 + *pfVar15) - auVar232._0_4_) * fVar226;
          auVar158._4_4_ = ((pfVar16[1] * fVar183 + pfVar15[1]) - auVar232._4_4_) * fVar214;
          auVar158._8_4_ = ((pfVar16[2] * fVar183 + pfVar15[2]) - auVar232._8_4_) * fVar170;
          auVar158._12_4_ = ((pfVar16[3] * fVar183 + pfVar15[3]) - auVar232._12_4_) * fVar171;
          pfVar16 = (float *)(uVar49 + 0x80 + uVar59);
          pfVar15 = (float *)(uVar49 + 0x20 + uVar59);
          auVar159._0_4_ = ((*pfVar16 * fVar183 + *pfVar15) - auVar113._0_4_) * fVar227;
          auVar159._4_4_ = ((pfVar16[1] * fVar183 + pfVar15[1]) - auVar113._4_4_) * fVar125;
          auVar159._8_4_ = ((pfVar16[2] * fVar183 + pfVar15[2]) - auVar113._8_4_) * fVar195;
          auVar159._12_4_ = ((pfVar16[3] * fVar183 + pfVar15[3]) - auVar113._12_4_) * fVar207;
          auVar159 = maxps(auVar158,auVar159);
          auVar128 = maxps(auVar219,auVar145);
          _local_1298 = maxps(auVar128,auVar159);
          pfVar16 = (float *)(uVar49 + 0x80 + local_1180);
          pfVar15 = (float *)(uVar49 + 0x20 + local_1180);
          auVar160._0_4_ = ((*pfVar16 * fVar183 + *pfVar15) - auVar176._0_4_) * fVar218;
          auVar160._4_4_ = ((pfVar16[1] * fVar183 + pfVar15[1]) - auVar176._4_4_) * fVar217;
          auVar160._8_4_ = ((pfVar16[2] * fVar183 + pfVar15[2]) - auVar176._8_4_) * fVar101;
          auVar160._12_4_ = ((pfVar16[3] * fVar183 + pfVar15[3]) - auVar176._12_4_) * fVar172;
          pfVar16 = (float *)(uVar49 + 0x80 + local_1188);
          pfVar15 = (float *)(uVar49 + 0x20 + local_1188);
          auVar164._0_4_ =
               ((*pfVar16 * fVar183 + *pfVar15) - auVar232._0_4_) * (float)local_10c8._0_4_;
          auVar164._4_4_ =
               ((pfVar16[1] * fVar183 + pfVar15[1]) - auVar232._4_4_) * (float)local_10c8._4_4_;
          auVar164._8_4_ = ((pfVar16[2] * fVar183 + pfVar15[2]) - auVar232._8_4_) * fStack_10c0;
          auVar164._12_4_ = ((pfVar16[3] * fVar183 + pfVar15[3]) - auVar232._12_4_) * fStack_10bc;
          pfVar16 = (float *)(uVar49 + 0x80 + local_1190);
          pfVar15 = (float *)(uVar49 + 0x20 + local_1190);
          auVar162._0_4_ = ((*pfVar16 * fVar183 + *pfVar15) - auVar113._0_4_) * fVar223;
          auVar162._4_4_ = ((pfVar16[1] * fVar183 + pfVar15[1]) - auVar113._4_4_) * fVar178;
          auVar162._8_4_ = ((pfVar16[2] * fVar183 + pfVar15[2]) - auVar113._8_4_) * fVar193;
          auVar162._12_4_ = ((pfVar16[3] * fVar183 + pfVar15[3]) - auVar113._12_4_) * fVar194;
          auVar159 = minps(auVar164,auVar162);
          auVar166._4_4_ = fStack_1034;
          auVar166._0_4_ = local_1038;
          auVar166._8_4_ = fVar102;
          auVar166._12_4_ = fVar222;
          auVar128 = minps(auVar166,auVar160);
          auVar128 = minps(auVar128,auVar159);
          if (((uint)uVar66 & 7) == 6) {
            bVar32 = (fVar183 < *(float *)(uVar49 + 0xf0) && *(float *)(uVar49 + 0xe0) <= fVar183)
                     && local_1298._0_4_ <= auVar128._0_4_;
            bVar33 = (fVar183 < *(float *)(uVar49 + 0xf4) && *(float *)(uVar49 + 0xe4) <= fVar183)
                     && local_1298._4_4_ <= auVar128._4_4_;
            bVar34 = (fVar183 < *(float *)(uVar49 + 0xf8) && *(float *)(uVar49 + 0xe8) <= fVar183)
                     && local_1298._8_4_ <= auVar128._8_4_;
            bVar35 = (fVar183 < *(float *)(uVar49 + 0xfc) && *(float *)(uVar49 + 0xec) <= fVar183)
                     && local_1298._12_4_ <= auVar128._12_4_;
          }
          else {
            bVar32 = local_1298._0_4_ <= auVar128._0_4_;
            bVar33 = local_1298._4_4_ <= auVar128._4_4_;
            bVar34 = local_1298._8_4_ <= auVar128._8_4_;
            bVar35 = local_1298._12_4_ <= auVar128._12_4_;
          }
          auVar103._0_4_ = (uint)bVar32 * -0x80000000;
          auVar103._4_4_ = (uint)bVar33 * -0x80000000;
          auVar103._8_4_ = (uint)bVar34 * -0x80000000;
          auVar103._12_4_ = (uint)bVar35 * -0x80000000;
          uVar54 = movmskps((int)local_1190,auVar103);
          context = (RayQueryContext *)CONCAT44((int)(local_1190 >> 0x20),uVar54);
          if (uVar54 == 0) goto LAB_006b408e;
          context = (RayQueryContext *)0x0;
          if ((byte)uVar54 != 0) {
            for (; ((byte)uVar54 >> (long)context & 1) == 0;
                context = (RayQueryContext *)((long)&context->scene + 1)) {
            }
          }
          uVar66 = *(ulong *)(uVar49 + (long)context * 8);
          uVar54 = (uVar54 & 0xff) - 1 & uVar54 & 0xff;
          if (uVar54 != 0) {
            uVar122 = *(uint *)(local_1298 + (long)context * 4);
            lVar50 = 0;
            if (uVar54 != 0) {
              for (; (uVar54 >> lVar50 & 1) == 0; lVar50 = lVar50 + 1) {
              }
            }
            uVar24 = *(ulong *)(uVar49 + lVar50 * 8);
            uVar123 = *(uint *)(local_1298 + lVar50 * 4);
            uVar54 = uVar54 - 1 & uVar54;
            context = (RayQueryContext *)(ulong)uVar54;
            if (uVar54 == 0) {
              if (uVar122 < uVar123) {
                *(ulong *)*pauVar62 = uVar24;
                *(uint *)((long)*pauVar62 + 8) = uVar123;
                pauVar62 = pauVar62 + 1;
              }
              else {
                *(ulong *)*pauVar62 = uVar66;
                *(uint *)((long)*pauVar62 + 8) = uVar122;
                pauVar62 = pauVar62 + 1;
                uVar66 = uVar24;
              }
            }
            else {
              auVar104._8_4_ = uVar122;
              auVar104._0_8_ = uVar66;
              auVar104._12_4_ = 0;
              auVar143._8_4_ = uVar123;
              auVar143._0_8_ = uVar24;
              auVar143._12_4_ = 0;
              lVar50 = 0;
              if (context != (RayQueryContext *)0x0) {
                for (; (uVar54 >> lVar50 & 1) == 0; lVar50 = lVar50 + 1) {
                }
              }
              uVar52 = *(undefined8 *)(uVar49 + lVar50 * 8);
              iVar68 = *(int *)(local_1298 + lVar50 * 4);
              auVar129._8_4_ = iVar68;
              auVar129._0_8_ = uVar52;
              auVar129._12_4_ = 0;
              auVar72._8_4_ = -(uint)((int)uVar122 < (int)uVar123);
              uVar54 = uVar54 - 1 & uVar54;
              if (uVar54 == 0) {
                auVar72._4_4_ = auVar72._8_4_;
                auVar72._0_4_ = auVar72._8_4_;
                auVar72._12_4_ = auVar72._8_4_;
                auVar161._8_4_ = uVar123;
                auVar161._0_8_ = uVar24;
                auVar161._12_4_ = 0;
                auVar159 = blendvps(auVar161,auVar104,auVar72);
                auVar128 = blendvps(auVar104,auVar143,auVar72);
                auVar73._8_4_ = -(uint)(auVar159._8_4_ < iVar68);
                auVar73._4_4_ = auVar73._8_4_;
                auVar73._0_4_ = auVar73._8_4_;
                auVar73._12_4_ = auVar73._8_4_;
                auVar144._8_4_ = iVar68;
                auVar144._0_8_ = uVar52;
                auVar144._12_4_ = 0;
                auVar145 = blendvps(auVar144,auVar159,auVar73);
                auVar162 = blendvps(auVar159,auVar129,auVar73);
                auVar74._8_4_ = -(uint)(auVar128._8_4_ < auVar162._8_4_);
                auVar74._4_4_ = auVar74._8_4_;
                auVar74._0_4_ = auVar74._8_4_;
                auVar74._12_4_ = auVar74._8_4_;
                auVar159 = blendvps(auVar162,auVar128,auVar74);
                auVar128 = blendvps(auVar128,auVar162,auVar74);
                *pauVar62 = auVar128;
                pauVar62[1] = auVar159;
                uVar66 = auVar145._0_8_;
                pauVar62 = pauVar62 + 2;
              }
              else {
                context = (RayQueryContext *)0x0;
                if (uVar54 != 0) {
                  for (; (uVar54 >> (long)context & 1) == 0;
                      context = (RayQueryContext *)((long)&context->scene + 1)) {
                  }
                }
                auVar75._4_4_ = auVar72._8_4_;
                auVar75._0_4_ = auVar72._8_4_;
                auVar75._8_4_ = auVar72._8_4_;
                auVar75._12_4_ = auVar72._8_4_;
                auVar162 = blendvps(auVar143,auVar104,auVar75);
                auVar128 = blendvps(auVar104,auVar143,auVar75);
                auVar165._8_4_ = *(int *)(local_1298 + (long)context * 4);
                auVar165._0_8_ = *(undefined8 *)(uVar49 + (long)context * 8);
                auVar165._12_4_ = 0;
                auVar76._8_4_ = -(uint)(iVar68 < *(int *)(local_1298 + (long)context * 4));
                auVar76._4_4_ = auVar76._8_4_;
                auVar76._0_4_ = auVar76._8_4_;
                auVar76._12_4_ = auVar76._8_4_;
                auVar145 = blendvps(auVar165,auVar129,auVar76);
                auVar159 = blendvps(auVar129,auVar165,auVar76);
                auVar77._8_4_ = -(uint)(auVar128._8_4_ < auVar159._8_4_);
                auVar77._4_4_ = auVar77._8_4_;
                auVar77._0_4_ = auVar77._8_4_;
                auVar77._12_4_ = auVar77._8_4_;
                auVar166 = blendvps(auVar159,auVar128,auVar77);
                auVar128 = blendvps(auVar128,auVar159,auVar77);
                auVar78._8_4_ = -(uint)(auVar162._8_4_ < auVar145._8_4_);
                auVar78._4_4_ = auVar78._8_4_;
                auVar78._0_4_ = auVar78._8_4_;
                auVar78._12_4_ = auVar78._8_4_;
                auVar159 = blendvps(auVar145,auVar162,auVar78);
                auVar162 = blendvps(auVar162,auVar145,auVar78);
                auVar79._8_4_ = -(uint)(auVar162._8_4_ < auVar166._8_4_);
                auVar79._4_4_ = auVar79._8_4_;
                auVar79._0_4_ = auVar79._8_4_;
                auVar79._12_4_ = auVar79._8_4_;
                auVar145 = blendvps(auVar166,auVar162,auVar79);
                auVar162 = blendvps(auVar162,auVar166,auVar79);
                *pauVar62 = auVar128;
                pauVar62[1] = auVar162;
                pauVar62[2] = auVar145;
                uVar66 = auVar159._0_8_;
                pauVar62 = pauVar62 + 3;
                fVar218 = local_11e8;
                fVar217 = fStack_11e4;
                fVar101 = fStack_11e0;
                fVar172 = fStack_11dc;
              }
            }
          }
        }
        local_11d8 = (ulong)((uint)uVar66 & 0xf) - 8;
        uVar66 = uVar66 & 0xfffffffffffffff0;
        fStack_1030 = fVar102;
        fStack_102c = fVar222;
        local_11a8 = pauVar62;
        local_1464._12_8_ = uVar66;
        for (local_11d0 = 0; local_11d0 != local_11d8; local_11d0 = local_11d0 + 1) {
          lVar50 = local_11d0 * 0x90;
          fVar126 = (*(float *)((long)&(This->collider).name + 4) -
                    *(float *)(uVar66 + 0x80 + lVar50)) * *(float *)(uVar66 + 0x84 + lVar50);
          uVar49 = *(ulong *)(uVar66 + 0x20 + lVar50);
          auVar105._8_8_ = 0;
          auVar105._0_8_ = uVar49;
          uVar24 = *(ulong *)(uVar66 + 0x24 + lVar50);
          auVar146._8_8_ = 0;
          auVar146._0_8_ = uVar24;
          bVar36 = (byte)uVar24;
          bVar71 = (byte)uVar49;
          bVar37 = (byte)(uVar24 >> 8);
          bVar95 = (byte)(uVar49 >> 8);
          bVar38 = (byte)(uVar24 >> 0x10);
          bVar96 = (byte)(uVar49 >> 0x10);
          bVar39 = (byte)(uVar24 >> 0x18);
          bVar97 = (byte)(uVar49 >> 0x18);
          bVar40 = (byte)(uVar24 >> 0x20);
          bVar98 = (byte)(uVar49 >> 0x20);
          bVar41 = (byte)(uVar24 >> 0x28);
          bVar99 = (byte)(uVar49 >> 0x28);
          bVar42 = (byte)(uVar24 >> 0x30);
          bVar100 = (byte)(uVar49 >> 0x30);
          bVar45 = (byte)(uVar49 >> 0x38);
          bVar43 = (byte)(uVar24 >> 0x38);
          auVar80[0] = -((byte)((bVar36 < bVar71) * bVar36 | (bVar36 >= bVar71) * bVar71) == bVar71)
          ;
          auVar80[1] = -((byte)((bVar37 < bVar95) * bVar37 | (bVar37 >= bVar95) * bVar95) == bVar95)
          ;
          auVar80[2] = -((byte)((bVar38 < bVar96) * bVar38 | (bVar38 >= bVar96) * bVar96) == bVar96)
          ;
          auVar80[3] = -((byte)((bVar39 < bVar97) * bVar39 | (bVar39 >= bVar97) * bVar97) == bVar97)
          ;
          auVar80[4] = -((byte)((bVar40 < bVar98) * bVar40 | (bVar40 >= bVar98) * bVar98) == bVar98)
          ;
          auVar80[5] = -((byte)((bVar41 < bVar99) * bVar41 | (bVar41 >= bVar99) * bVar99) == bVar99)
          ;
          auVar80[6] = -((byte)((bVar42 < bVar100) * bVar42 | (bVar42 >= bVar100) * bVar100) ==
                        bVar100);
          auVar80[7] = -((byte)((bVar43 < bVar45) * bVar43 | (bVar43 >= bVar45) * bVar45) == bVar45)
          ;
          auVar80[8] = 0xff;
          auVar80[9] = 0xff;
          auVar80[10] = 0xff;
          auVar80[0xb] = 0xff;
          auVar80[0xc] = 0xff;
          auVar80[0xd] = 0xff;
          auVar80[0xe] = 0xff;
          auVar80[0xf] = 0xff;
          auVar219 = pmovzxbd(auVar105,auVar105);
          fVar215 = *(float *)(uVar66 + 0x38 + lVar50);
          fVar218 = *(float *)(uVar66 + 0x3c + lVar50);
          fVar217 = *(float *)(uVar66 + 0x40 + lVar50);
          fVar101 = *(float *)(uVar66 + 0x44 + lVar50);
          fVar195 = (float)auVar219._0_4_ * fVar101 + fVar215;
          fVar207 = (float)auVar219._4_4_ * fVar101 + fVar215;
          fVar227 = (float)auVar219._8_4_ * fVar101 + fVar215;
          fVar214 = (float)auVar219._12_4_ * fVar101 + fVar215;
          auVar106._8_8_ = 0;
          auVar106._0_8_ = *(ulong *)(uVar66 + 0x50 + lVar50);
          auVar219 = pmovzxbd(auVar106,auVar106);
          fVar172 = *(float *)(uVar66 + 0x74 + lVar50);
          fVar178 = *(float *)(uVar66 + 0x68 + lVar50);
          auVar128 = pmovzxbd(auVar146,auVar146);
          fVar196 = (float)auVar128._0_4_ * fVar101 + fVar215;
          fVar208 = (float)auVar128._4_4_ * fVar101 + fVar215;
          fVar211 = (float)auVar128._8_4_ * fVar101 + fVar215;
          fVar215 = (float)auVar128._12_4_ * fVar101 + fVar215;
          auVar147._8_8_ = 0;
          auVar147._0_8_ = *(ulong *)(uVar66 + 0x54 + lVar50);
          auVar128 = pmovzxbd(auVar147,auVar147);
          auVar167._8_8_ = 0;
          auVar167._0_8_ = *(ulong *)(uVar66 + 0x28 + lVar50);
          auVar159 = pmovzxbd(auVar167,auVar167);
          fVar101 = *(float *)(uVar66 + 0x48 + lVar50);
          fVar182 = (float)auVar159._0_4_ * fVar101 + fVar218;
          fVar190 = (float)auVar159._4_4_ * fVar101 + fVar218;
          fVar224 = (float)auVar159._8_4_ * fVar101 + fVar218;
          fVar226 = (float)auVar159._12_4_ * fVar101 + fVar218;
          auVar168._8_8_ = 0;
          auVar168._0_8_ = *(ulong *)(uVar66 + 0x58 + lVar50);
          auVar145 = pmovzxbd(auVar168,auVar168);
          fVar193 = *(float *)(uVar66 + 0x78 + lVar50);
          fVar194 = *(float *)(uVar66 + 0x6c + lVar50);
          auVar184._8_8_ = 0;
          auVar184._0_8_ = *(ulong *)(uVar66 + 0x2c + lVar50);
          auVar159 = pmovzxbd(auVar184,auVar184);
          fVar183 = (float)auVar159._0_4_ * fVar101 + fVar218;
          fVar191 = (float)auVar159._4_4_ * fVar101 + fVar218;
          fVar192 = (float)auVar159._8_4_ * fVar101 + fVar218;
          fVar218 = (float)auVar159._12_4_ * fVar101 + fVar218;
          auVar174._8_8_ = 0;
          auVar174._0_8_ = *(ulong *)(uVar66 + 0x5c + lVar50);
          auVar162 = pmovzxbd(auVar174,auVar174);
          auVar185._8_8_ = 0;
          auVar185._0_8_ = *(ulong *)(uVar66 + 0x30 + lVar50);
          auVar159 = pmovzxbd(auVar185,auVar185);
          fVar101 = *(float *)(uVar66 + 0x4c + lVar50);
          fVar197 = (float)auVar159._0_4_ * fVar101 + fVar217;
          fVar209 = (float)auVar159._4_4_ * fVar101 + fVar217;
          fVar212 = (float)auVar159._8_4_ * fVar101 + fVar217;
          fVar216 = (float)auVar159._12_4_ * fVar101 + fVar217;
          auVar186._8_8_ = 0;
          auVar186._0_8_ = *(ulong *)(uVar66 + 0x60 + lVar50);
          auVar166 = pmovzxbd(auVar186,auVar186);
          fVar223 = *(float *)(uVar66 + 0x7c + lVar50);
          fVar125 = *(float *)(uVar66 + 0x70 + lVar50);
          auVar199._8_8_ = 0;
          auVar199._0_8_ = *(ulong *)(uVar66 + 0x34 + lVar50);
          auVar159 = pmovzxbd(auVar199,auVar199);
          fVar198 = (float)auVar159._0_4_ * fVar101 + fVar217;
          fVar210 = (float)auVar159._4_4_ * fVar101 + fVar217;
          fVar213 = (float)auVar159._8_4_ * fVar101 + fVar217;
          fVar217 = (float)auVar159._12_4_ * fVar101 + fVar217;
          auVar163._8_8_ = 0;
          auVar163._0_8_ = *(ulong *)(uVar66 + 100 + lVar50);
          auVar159 = pmovzxbd(auVar163,auVar163);
          fVar101 = (((((float)auVar219._0_4_ * fVar172 + fVar178) - fVar195) * fVar126 + fVar195) -
                    auVar176._0_4_) * local_1168;
          fVar195 = (((((float)auVar219._4_4_ * fVar172 + fVar178) - fVar207) * fVar126 + fVar207) -
                    auVar176._4_4_) * fStack_1164;
          fVar207 = (((((float)auVar219._8_4_ * fVar172 + fVar178) - fVar227) * fVar126 + fVar227) -
                    auVar176._8_4_) * fStack_1160;
          fVar227 = (((((float)auVar219._12_4_ * fVar172 + fVar178) - fVar214) * fVar126 + fVar214)
                    - auVar176._12_4_) * fStack_115c;
          fVar214 = (((((float)auVar145._0_4_ * fVar193 + fVar194) - fVar182) * fVar126 + fVar182) -
                    auVar232._0_4_) * local_1178;
          fVar170 = (((((float)auVar145._4_4_ * fVar193 + fVar194) - fVar190) * fVar126 + fVar190) -
                    auVar232._4_4_) * fStack_1174;
          fVar171 = (((((float)auVar145._8_4_ * fVar193 + fVar194) - fVar224) * fVar126 + fVar224) -
                    auVar232._8_4_) * fStack_1170;
          fVar226 = (((((float)auVar145._12_4_ * fVar193 + fVar194) - fVar226) * fVar126 + fVar226)
                    - auVar232._12_4_) * fStack_116c;
          fVar182 = (((((float)auVar128._0_4_ * fVar172 + fVar178) - fVar196) * fVar126 + fVar196) -
                    auVar176._0_4_) * local_11e8;
          fVar190 = (((((float)auVar128._4_4_ * fVar172 + fVar178) - fVar208) * fVar126 + fVar208) -
                    auVar176._4_4_) * fStack_11e4;
          fVar224 = (((((float)auVar128._8_4_ * fVar172 + fVar178) - fVar211) * fVar126 + fVar211) -
                    auVar176._8_4_) * fStack_11e0;
          fVar215 = (((((float)auVar128._12_4_ * fVar172 + fVar178) - fVar215) * fVar126 + fVar215)
                    - auVar176._12_4_) * fStack_11dc;
          fVar172 = (((((float)auVar162._0_4_ * fVar193 + fVar194) - fVar183) * fVar126 + fVar183) -
                    auVar232._0_4_) * (float)local_10c8._0_4_;
          fVar178 = (((((float)auVar162._4_4_ * fVar193 + fVar194) - fVar191) * fVar126 + fVar191) -
                    auVar232._4_4_) * (float)local_10c8._4_4_;
          fVar183 = (((((float)auVar162._8_4_ * fVar193 + fVar194) - fVar192) * fVar126 + fVar192) -
                    auVar232._8_4_) * fStack_10c0;
          fVar218 = (((((float)auVar162._12_4_ * fVar193 + fVar194) - fVar218) * fVar126 + fVar218)
                    - auVar232._12_4_) * fStack_10bc;
          uVar127 = (uint)((int)fVar182 < (int)fVar101) * (int)fVar182 |
                    (uint)((int)fVar182 >= (int)fVar101) * (int)fVar101;
          uVar139 = (uint)((int)fVar190 < (int)fVar195) * (int)fVar190 |
                    (uint)((int)fVar190 >= (int)fVar195) * (int)fVar195;
          uVar140 = (uint)((int)fVar224 < (int)fVar207) * (int)fVar224 |
                    (uint)((int)fVar224 >= (int)fVar207) * (int)fVar207;
          uVar141 = (uint)((int)fVar215 < (int)fVar227) * (int)fVar215 |
                    (uint)((int)fVar215 >= (int)fVar227) * (int)fVar227;
          uVar142 = (uint)((int)fVar182 < (int)fVar101) * (int)fVar101 |
                    (uint)((int)fVar182 >= (int)fVar101) * (int)fVar182;
          uVar155 = (uint)((int)fVar190 < (int)fVar195) * (int)fVar195 |
                    (uint)((int)fVar190 >= (int)fVar195) * (int)fVar190;
          uVar156 = (uint)((int)fVar224 < (int)fVar207) * (int)fVar207 |
                    (uint)((int)fVar224 >= (int)fVar207) * (int)fVar224;
          uVar157 = (uint)((int)fVar215 < (int)fVar227) * (int)fVar227 |
                    (uint)((int)fVar215 >= (int)fVar227) * (int)fVar215;
          uVar54 = (uint)((int)fVar172 < (int)fVar214) * (int)fVar172 |
                   (uint)((int)fVar172 >= (int)fVar214) * (int)fVar214;
          uVar122 = (uint)((int)fVar178 < (int)fVar170) * (int)fVar178 |
                    (uint)((int)fVar178 >= (int)fVar170) * (int)fVar170;
          uVar123 = (uint)((int)fVar183 < (int)fVar171) * (int)fVar183 |
                    (uint)((int)fVar183 >= (int)fVar171) * (int)fVar171;
          uVar124 = (uint)((int)fVar218 < (int)fVar226) * (int)fVar218 |
                    (uint)((int)fVar218 >= (int)fVar226) * (int)fVar226;
          uVar54 = ((int)uVar54 < (int)uVar127) * uVar127 | ((int)uVar54 >= (int)uVar127) * uVar54;
          uVar122 = ((int)uVar122 < (int)uVar139) * uVar139 |
                    ((int)uVar122 >= (int)uVar139) * uVar122;
          uVar123 = ((int)uVar123 < (int)uVar140) * uVar140 |
                    ((int)uVar123 >= (int)uVar140) * uVar123;
          uVar124 = ((int)uVar124 < (int)uVar141) * uVar141 |
                    ((int)uVar124 >= (int)uVar141) * uVar124;
          uVar127 = (uint)((int)fVar172 < (int)fVar214) * (int)fVar214 |
                    (uint)((int)fVar172 >= (int)fVar214) * (int)fVar172;
          uVar139 = (uint)((int)fVar178 < (int)fVar170) * (int)fVar170 |
                    (uint)((int)fVar178 >= (int)fVar170) * (int)fVar178;
          uVar140 = (uint)((int)fVar183 < (int)fVar171) * (int)fVar171 |
                    (uint)((int)fVar183 >= (int)fVar171) * (int)fVar183;
          uVar141 = (uint)((int)fVar218 < (int)fVar226) * (int)fVar226 |
                    (uint)((int)fVar218 >= (int)fVar226) * (int)fVar218;
          fVar172 = (((((float)auVar166._0_4_ * fVar223 + fVar125) - fVar197) * fVar126 + fVar197) -
                    auVar113._0_4_) * local_1158;
          fVar178 = (((((float)auVar166._4_4_ * fVar223 + fVar125) - fVar209) * fVar126 + fVar209) -
                    auVar113._4_4_) * fStack_1154;
          fVar193 = (((((float)auVar166._8_4_ * fVar223 + fVar125) - fVar212) * fVar126 + fVar212) -
                    auVar113._8_4_) * fStack_1150;
          fVar194 = (((((float)auVar166._12_4_ * fVar223 + fVar125) - fVar216) * fVar126 + fVar216)
                    - auVar113._12_4_) * fStack_114c;
          fVar215 = (((((float)auVar159._0_4_ * fVar223 + fVar125) - fVar198) * fVar126 + fVar198) -
                    auVar113._0_4_) * local_1148;
          fVar218 = (((((float)auVar159._4_4_ * fVar223 + fVar125) - fVar210) * fVar126 + fVar210) -
                    auVar113._4_4_) * fStack_1144;
          fVar101 = (((((float)auVar159._8_4_ * fVar223 + fVar125) - fVar213) * fVar126 + fVar213) -
                    auVar113._8_4_) * fStack_1140;
          fVar217 = (((((float)auVar159._12_4_ * fVar223 + fVar125) - fVar217) * fVar126 + fVar217)
                    - auVar113._12_4_) * fStack_113c;
          uVar173 = ((int)uVar142 < (int)uVar127) * uVar142 |
                    ((int)uVar142 >= (int)uVar127) * uVar127;
          uVar179 = ((int)uVar155 < (int)uVar139) * uVar155 |
                    ((int)uVar155 >= (int)uVar139) * uVar139;
          uVar180 = ((int)uVar156 < (int)uVar140) * uVar156 |
                    ((int)uVar156 >= (int)uVar140) * uVar140;
          uVar181 = ((int)uVar157 < (int)uVar141) * uVar157 |
                    ((int)uVar157 >= (int)uVar141) * uVar141;
          uVar127 = (uint)((int)fVar215 < (int)fVar172) * (int)fVar215 |
                    (uint)((int)fVar215 >= (int)fVar172) * (int)fVar172;
          uVar139 = (uint)((int)fVar218 < (int)fVar178) * (int)fVar218 |
                    (uint)((int)fVar218 >= (int)fVar178) * (int)fVar178;
          uVar140 = (uint)((int)fVar101 < (int)fVar193) * (int)fVar101 |
                    (uint)((int)fVar101 >= (int)fVar193) * (int)fVar193;
          uVar141 = (uint)((int)fVar217 < (int)fVar194) * (int)fVar217 |
                    (uint)((int)fVar217 >= (int)fVar194) * (int)fVar194;
          uVar142 = (uint)((int)fVar215 < (int)fVar172) * (int)fVar172 |
                    (uint)((int)fVar215 >= (int)fVar172) * (int)fVar215;
          uVar155 = (uint)((int)fVar218 < (int)fVar178) * (int)fVar178 |
                    (uint)((int)fVar218 >= (int)fVar178) * (int)fVar218;
          uVar156 = (uint)((int)fVar101 < (int)fVar193) * (int)fVar193 |
                    (uint)((int)fVar101 >= (int)fVar193) * (int)fVar101;
          uVar157 = (uint)((int)fVar217 < (int)fVar194) * (int)fVar194 |
                    (uint)((int)fVar217 >= (int)fVar194) * (int)fVar217;
          uVar127 = (uint)((int)uVar127 < (int)local_1138._0_4_) * local_1138._0_4_ |
                    ((int)uVar127 >= (int)local_1138._0_4_) * uVar127;
          uVar139 = (uint)((int)uVar139 < (int)local_1138._4_4_) * local_1138._4_4_ |
                    ((int)uVar139 >= (int)local_1138._4_4_) * uVar139;
          uVar140 = (uint)((int)uVar140 < (int)local_1138._8_4_) * local_1138._8_4_ |
                    ((int)uVar140 >= (int)local_1138._8_4_) * uVar140;
          uVar141 = (uint)((int)uVar141 < (int)local_1138._12_4_) * local_1138._12_4_ |
                    ((int)uVar141 >= (int)local_1138._12_4_) * uVar141;
          local_f88 = (float)(((int)uVar127 < (int)uVar54) * uVar54 |
                             ((int)uVar127 >= (int)uVar54) * uVar127);
          uStack_f84 = ((int)uVar139 < (int)uVar122) * uVar122 |
                       ((int)uVar139 >= (int)uVar122) * uVar139;
          uStack_f80 = ((int)uVar140 < (int)uVar123) * uVar123 |
                       ((int)uVar140 >= (int)uVar123) * uVar140;
          uStack_f7c = ((int)uVar141 < (int)uVar124) * uVar124 |
                       ((int)uVar141 >= (int)uVar124) * uVar141;
          uVar54 = (uint)((int)local_1038 < (int)uVar142) * (int)local_1038 |
                   ((int)local_1038 >= (int)uVar142) * uVar142;
          uVar122 = (uint)((int)fStack_1034 < (int)uVar155) * (int)fStack_1034 |
                    ((int)fStack_1034 >= (int)uVar155) * uVar155;
          uVar123 = (uint)((int)fVar102 < (int)uVar156) * (int)fVar102 |
                    ((int)fVar102 >= (int)uVar156) * uVar156;
          uVar124 = (uint)((int)fVar222 < (int)uVar157) * (int)fVar222 |
                    ((int)fVar222 >= (int)uVar157) * uVar157;
          auVar130._0_4_ =
               -(uint)((int)(((int)uVar173 < (int)uVar54) * uVar173 |
                            ((int)uVar173 >= (int)uVar54) * uVar54) < (int)local_f88);
          auVar130._4_4_ =
               -(uint)((int)(((int)uVar179 < (int)uVar122) * uVar179 |
                            ((int)uVar179 >= (int)uVar122) * uVar122) < (int)uStack_f84);
          auVar130._8_4_ =
               -(uint)((int)(((int)uVar180 < (int)uVar123) * uVar180 |
                            ((int)uVar180 >= (int)uVar123) * uVar123) < (int)uStack_f80);
          auVar130._12_4_ =
               -(uint)((int)(((int)uVar181 < (int)uVar124) * uVar181 |
                            ((int)uVar181 >= (int)uVar124) * uVar124) < (int)uStack_f7c);
          auVar219 = pmovsxbd(auVar80,auVar80);
          uVar55 = movmskps((int)context,~auVar130 & auVar219);
          context = (RayQueryContext *)CONCAT44((int)((ulong)context >> 0x20),uVar55);
          local_1330 = context;
          local_11a0 = lVar50 + uVar66;
          fVar218 = local_11e8;
          fVar217 = fStack_11e4;
          fVar101 = fStack_11e0;
          fVar172 = fStack_11dc;
LAB_006b4715:
          pIVar48 = local_11b0;
          auVar219 = _local_12e8;
          pRVar47 = local_13f0;
          if (local_1330 != (RayQueryContext *)0x0) {
            context = (RayQueryContext *)0x0;
            if (local_1330 != (RayQueryContext *)0x0) {
              for (; ((ulong)local_1330 >> (long)context & 1) == 0;
                  context = (RayQueryContext *)((long)&context->scene + 1)) {
              }
            }
            local_1330 = (RayQueryContext *)
                         ((ulong)local_1330 & (ulong)((long)&local_1330[-1].args + 7U));
            fVar215 = *(float *)&(This->intersector1).intersect;
            if ((&local_f88)[(long)context] <= fVar215) {
              local_f98 = ZEXT416((uint)fVar215);
              uVar22 = *(ushort *)(local_11a0 + (long)context * 8);
              uVar54 = *(uint *)(local_11a0 + 0x88);
              pRVar57 = (RayQueryContext *)(ulong)uVar54;
              uVar122 = *(uint *)(local_11a0 + 4 + (long)context * 8);
              local_1198 = *(long *)&(ray->super_RayK<1>).org.field_0;
              local_1464._4_8_ = pRVar57;
              lVar50 = *(long *)(*(long *)(local_1198 + 0x1e8) + (long)pRVar57 * 8);
              local_1464._20_8_ = (ulong)uVar122;
              local_13a8 = (ulong)uVar122 * *(long *)(lVar50 + 0x68);
              uVar23 = *(ushort *)(local_11a0 + 2 + (long)context * 8);
              fVar102 = *(float *)(lVar50 + 0x2c);
              fVar222 = ((*(float *)((long)&(This->collider).name + 4) - fVar102) /
                        (*(float *)(lVar50 + 0x30) - fVar102)) * *(float *)(lVar50 + 0x28);
              auVar131 = roundss(ZEXT416((uint)fVar102),ZEXT416((uint)fVar222),9);
              fVar102 = *(float *)(lVar50 + 0x28) + -1.0;
              if (fVar102 <= auVar131._0_4_) {
                auVar131._0_4_ = fVar102;
              }
              fVar102 = 0.0;
              if (0.0 <= auVar131._0_4_) {
                fVar102 = auVar131._0_4_;
              }
              local_13b8 = *(long *)(lVar50 + 0x58);
              uVar124 = uVar22 & 0x7fff;
              uVar123 = *(uint *)(local_13b8 + 4 + local_13a8);
              uVar63 = (ulong)uVar123;
              uVar60 = (ulong)(uVar123 * (uVar23 & 0x7fff) +
                              *(int *)(local_13b8 + local_13a8) + uVar124);
              lVar61 = *(long *)(lVar50 + 0xe0);
              lVar67 = (long)(int)fVar102 * 0x38;
              lVar25 = *(long *)(lVar61 + 0x10 + lVar67);
              lVar26 = *(long *)(lVar61 + lVar67);
              puVar1 = (undefined8 *)(lVar26 + lVar25 * uVar60);
              uVar52 = *puVar1;
              lVar27 = *(long *)(lVar61 + 0x48 + lVar67);
              pfVar15 = (float *)(lVar26 + (uVar60 + 1) * lVar25);
              lVar50 = uVar60 + uVar63;
              pfVar16 = (float *)(lVar26 + lVar50 * lVar25);
              lVar65 = uVar60 + uVar63 + 1;
              pfVar2 = (float *)(lVar26 + lVar65 * lVar25);
              uVar59 = (ulong)(-1 < (short)uVar22);
              lVar58 = uVar60 + uVar59 + 1;
              pfVar3 = (float *)(lVar26 + lVar58 * lVar25);
              lVar56 = uVar59 + lVar65;
              uVar59 = 0;
              if (-1 < (short)uVar23) {
                uVar59 = uVar63;
              }
              pfVar4 = (float *)(lVar26 + lVar56 * lVar25);
              pfVar5 = (float *)(lVar26 + (lVar50 + uVar59) * lVar25);
              lVar51 = lVar27 * (lVar65 + uVar59);
              pfVar6 = (float *)(lVar26 + (lVar65 + uVar59) * lVar25);
              fStack_1390 = *(float *)(lVar26 + lVar25 * (uVar59 + lVar56) + 4);
              context = *(RayQueryContext **)(lVar61 + 0x38 + lVar67);
              ppSVar7 = (Scene **)((long)&context->scene + lVar27 * uVar60);
              ppSVar8 = (Scene **)((long)&context->scene + lVar27 * (uVar60 + 1));
              ppSVar9 = (Scene **)((long)&context->scene + lVar27 * lVar50);
              ppSVar10 = (Scene **)((long)&context->scene + lVar27 * lVar65);
              ppSVar11 = (Scene **)((long)&context->scene + lVar27 * lVar58);
              fVar222 = fVar222 - fVar102;
              ppSVar12 = (Scene **)((long)&context->scene + lVar27 * lVar56);
              local_1478._0_4_ = (undefined4)uVar52;
              local_1478._4_4_ = (undefined4)((ulong)uVar52 >> 0x20);
              fStack_1470 = (float)puVar1[1];
              ppSVar13 = (Scene **)((long)&context->scene + lVar27 * (lVar50 + uVar59));
              local_12e8._0_4_ = (*(float *)ppSVar8 - *pfVar15) * fVar222 + *pfVar15;
              local_1068 = (*(float *)((long)ppSVar8 + 4) - pfVar15[1]) * fVar222 + pfVar15[1];
              local_1108 = (*(float *)(ppSVar8 + 1) - pfVar15[2]) * fVar222 + pfVar15[2];
              ppSVar8 = (Scene **)((long)&context->scene + lVar51);
              fVar217 = (*(float *)ppSVar9 - *pfVar16) * fVar222 + *pfVar16;
              fVar195 = (*(float *)((long)ppSVar9 + 4) - pfVar16[1]) * fVar222 + pfVar16[1];
              local_1428 = (*(float *)(ppSVar9 + 1) - pfVar16[2]) * fVar222 + pfVar16[2];
              local_1388 = (*(float *)ppSVar10 - *pfVar2) * fVar222 + *pfVar2;
              local_1398 = (*(float *)((long)ppSVar10 + 4) - pfVar2[1]) * fVar222 + pfVar2[1];
              fVar178 = (*(float *)(ppSVar10 + 1) - pfVar2[2]) * fVar222 + pfVar2[2];
              local_12e8._4_4_ = (*(float *)ppSVar11 - *pfVar3) * fVar222 + *pfVar3;
              fStack_1064 = (*(float *)((long)ppSVar11 + 4) - pfVar3[1]) * fVar222 + pfVar3[1];
              fStack_1104 = (*(float *)(ppSVar11 + 1) - pfVar3[2]) * fVar222 + pfVar3[2];
              fStack_1384 = (*(float *)ppSVar12 - *pfVar4) * fVar222 + *pfVar4;
              fStack_1394 = (*(float *)((long)ppSVar12 + 4) - pfVar4[1]) * fVar222 + pfVar4[1];
              fStack_1434 = (*(float *)(ppSVar12 + 1) - pfVar4[2]) * fVar222 + pfVar4[2];
              fStack_1074 = (*(float *)ppSVar13 - *pfVar5) * fVar222 + *pfVar5;
              fStack_106c = (*(float *)((long)ppSVar13 + 4) - pfVar5[1]) * fVar222 + pfVar5[1];
              fStack_1034 = (*(float *)(ppSVar13 + 1) - pfVar5[2]) * fVar222 + pfVar5[2];
              local_1078 = (*(float *)ppSVar8 - *pfVar6) * fVar222 + *pfVar6;
              fStack_138c = (*(float *)((long)ppSVar8 + 4) - pfVar6[1]) * fVar222 + pfVar6[1];
              local_1038 = (*(float *)(ppSVar8 + 1) - pfVar6[2]) * fVar222 + pfVar6[2];
              fStack_1390 = (*(float *)((long)&context->scene + (uVar59 + lVar56) * lVar27 + 4) -
                            fStack_1390) * fVar222 + fStack_1390;
              _fStack_12e0 = auVar219._8_8_;
              auVar113 = _local_12e8;
              local_1438._0_2_ = SUB42(fVar178,0);
              local_1438._2_2_ = (undefined2)((uint)fVar178 >> 0x10);
              local_1464._28_4_ = *(undefined4 *)&local_11b0->ptr;
              fVar102 = *(float *)((long)&local_11b0->ptr + 4);
              fVar218 = *(float *)&local_11b0->leafIntersector;
              local_fb8 = ((*(float *)((long)ppSVar7 + 4) - (float)local_1478._4_4_) * fVar222 +
                          (float)local_1478._4_4_) - fVar102;
              fStack_fb4 = local_1068 - fVar102;
              fStack_fb0 = local_1398 - fVar102;
              fStack_fac = fVar195 - fVar102;
              local_fa8 = ((*(float *)(ppSVar7 + 1) - fStack_1470) * fVar222 + fStack_1470) -
                          fVar218;
              fStack_fa4 = local_1108 - fVar218;
              fStack_fa0 = fVar178 - fVar218;
              fStack_f9c = local_1428 - fVar218;
              fStack_1070 = fStack_138c;
              fVar195 = fVar195 - fVar102;
              fVar207 = local_1398 - fVar102;
              fVar227 = fStack_138c - fVar102;
              fVar126 = fStack_106c - fVar102;
              local_1428 = local_1428 - fVar218;
              fStack_1424 = fVar178 - fVar218;
              fStack_1420 = local_1038 - fVar218;
              fStack_141c = fStack_1034 - fVar218;
              local_1418 = fVar195;
              fStack_1414 = fVar207;
              fStack_1410 = fVar227;
              fStack_140c = fVar126;
              local_fd8 = fVar195 - local_fb8;
              fStack_fd4 = fVar207 - fStack_fb4;
              fStack_fd0 = fVar227 - fStack_fb0;
              fStack_fcc = fVar126 - fStack_fac;
              local_fc8 = local_1428 - local_fa8;
              fStack_fc4 = fStack_1424 - fStack_fa4;
              fStack_fc0 = fStack_1420 - fStack_fa0;
              fStack_fbc = fStack_141c - fStack_f9c;
              fStack_1444 = (float)local_1464._28_4_;
              fStack_1440 = (float)local_1464._28_4_;
              fStack_143c = (float)local_1464._28_4_;
              fVar211 = ((*(float *)ppSVar7 - (float)local_1478._0_4_) * fVar222 +
                        (float)local_1478._0_4_) - (float)local_1464._28_4_;
              fVar212 = (float)local_12e8._0_4_ - (float)local_1464._28_4_;
              fStack_1480 = fStack_1480 - (float)local_1464._28_4_;
              fStack_147c = fStack_147c - (float)local_1464._28_4_;
              local_1088 = CONCAT44(local_1388,fVar217);
              fVar217 = fVar217 - (float)local_1464._28_4_;
              fVar101 = local_1388 - (float)local_1464._28_4_;
              fVar193 = local_1078 - (float)local_1464._28_4_;
              fVar223 = fStack_1074 - (float)local_1464._28_4_;
              local_fe8 = fVar217 - fVar211;
              fStack_fe4 = fVar101 - fVar212;
              fStack_fe0 = fVar193 - fStack_1480;
              fStack_fdc = fVar223 - fStack_147c;
              local_12a8 = *(float *)&(local_11b0->collider).collide;
              local_1478._4_4_ = *(float *)((long)&(local_11b0->collider).collide + 4);
              local_1378 = *(float *)&(local_11b0->collider).name;
              local_1478._0_4_ = local_1478._4_4_;
              fStack_1470 = (float)local_1478._4_4_;
              fStack_146c = (float)local_1478._4_4_;
              local_1008 = (local_fd8 * (local_1428 + local_fa8) - local_fc8 * (fVar195 + local_fb8)
                           ) * local_12a8 +
                           (local_fc8 * (fVar217 + fVar211) - (local_1428 + local_fa8) * local_fe8)
                           * (float)local_1478._4_4_ +
                           ((fVar195 + local_fb8) * local_fe8 - (fVar217 + fVar211) * local_fd8) *
                           local_1378;
              fStack_1004 = (fStack_fd4 * (fStack_1424 + fStack_fa4) -
                            fStack_fc4 * (fVar207 + fStack_fb4)) * local_12a8 +
                            (fStack_fc4 * (fVar101 + fVar212) -
                            (fStack_1424 + fStack_fa4) * fStack_fe4) * (float)local_1478._4_4_ +
                            ((fVar207 + fStack_fb4) * fStack_fe4 - (fVar101 + fVar212) * fStack_fd4)
                            * local_1378;
              fStack_1000 = (fStack_fd0 * (fStack_1420 + fStack_fa0) -
                            fStack_fc0 * (fVar227 + fStack_fb0)) * local_12a8 +
                            (fStack_fc0 * (fVar193 + fStack_1480) -
                            (fStack_1420 + fStack_fa0) * fStack_fe0) * (float)local_1478._4_4_ +
                            ((fVar227 + fStack_fb0) * fStack_fe0 -
                            (fVar193 + fStack_1480) * fStack_fd0) * local_1378;
              fStack_ffc = (fStack_fcc * (fStack_141c + fStack_f9c) -
                           fStack_fbc * (fVar126 + fStack_fac)) * local_12a8 +
                           (fStack_fbc * (fVar223 + fStack_147c) -
                           (fStack_141c + fStack_f9c) * fStack_fdc) * (float)local_1478._4_4_ +
                           ((fVar126 + fStack_fac) * fStack_fdc -
                           (fVar223 + fStack_147c) * fStack_fcc) * local_1378;
              fStack_1060 = fStack_1394;
              fStack_105c = local_1398;
              local_1318 = fVar102;
              fStack_1314 = fVar102;
              fStack_1310 = fVar102;
              fStack_130c = fVar102;
              local_10f8 = local_1068 - fVar102;
              fStack_10f4 = fStack_1064 - fVar102;
              fStack_10f0 = fStack_1394 - fVar102;
              fStack_10ec = local_1398 - fVar102;
              local_1058 = CONCAT44(fStack_1104,local_1108);
              _local_1048 = CONCAT44(fVar178,fStack_1434);
              local_1308 = fVar218;
              fStack_1304 = fVar218;
              fStack_1300 = fVar218;
              fStack_12fc = fVar218;
              local_1108 = local_1108 - fVar218;
              fStack_1104 = fStack_1104 - fVar218;
              fStack_1100 = fStack_1434 - fVar218;
              fStack_10fc = fVar178 - fVar218;
              fVar198 = local_fb8 - local_10f8;
              fVar208 = fStack_fb4 - fStack_10f4;
              fVar209 = fStack_fb0 - fStack_10f0;
              fVar210 = fStack_fac - fStack_10ec;
              fVar191 = local_fa8 - local_1108;
              fVar192 = fStack_fa4 - fStack_1104;
              fVar196 = fStack_fa0 - fStack_1100;
              fVar197 = fStack_f9c - fStack_10fc;
              fStack_12e0 = auVar219._8_4_;
              fStack_12dc = auVar219._12_4_;
              local_1118 = (float)local_12e8._0_4_ - (float)local_1464._28_4_;
              fStack_1114 = (float)local_12e8._4_4_ - (float)local_1464._28_4_;
              fStack_1110 = fStack_12e0 - (float)local_1464._28_4_;
              fStack_110c = fStack_12dc - (float)local_1464._28_4_;
              fVar170 = fVar211 - local_1118;
              fVar171 = fVar212 - fStack_1114;
              fVar226 = fStack_1480 - fStack_1110;
              fVar183 = fStack_147c - fStack_110c;
              auVar233._0_4_ =
                   (fVar198 * (local_fa8 + local_1108) - fVar191 * (local_fb8 + local_10f8)) *
                   local_12a8 +
                   (fVar191 * (fVar211 + local_1118) - (local_fa8 + local_1108) * fVar170) *
                   (float)local_1478._4_4_ +
                   ((local_fb8 + local_10f8) * fVar170 - (fVar211 + local_1118) * fVar198) *
                   local_1378;
              auVar233._4_4_ =
                   (fVar208 * (fStack_fa4 + fStack_1104) - fVar192 * (fStack_fb4 + fStack_10f4)) *
                   local_12a8 +
                   (fVar192 * (fVar212 + fStack_1114) - (fStack_fa4 + fStack_1104) * fVar171) *
                   (float)local_1478._4_4_ +
                   ((fStack_fb4 + fStack_10f4) * fVar171 - (fVar212 + fStack_1114) * fVar208) *
                   local_1378;
              auVar233._8_4_ =
                   (fVar209 * (fStack_fa0 + fStack_1100) - fVar196 * (fStack_fb0 + fStack_10f0)) *
                   local_12a8 +
                   (fVar196 * (fStack_1480 + fStack_1110) - (fStack_fa0 + fStack_1100) * fVar226) *
                   (float)local_1478._4_4_ +
                   ((fStack_fb0 + fStack_10f0) * fVar226 - (fStack_1480 + fStack_1110) * fVar209) *
                   local_1378;
              auVar233._12_4_ =
                   (fVar210 * (fStack_f9c + fStack_10fc) - fVar197 * (fStack_fac + fStack_10ec)) *
                   local_12a8 +
                   (fVar197 * (fStack_147c + fStack_110c) - (fStack_f9c + fStack_10fc) * fVar183) *
                   (float)local_1478._4_4_ +
                   ((fStack_fac + fStack_10ec) * fVar183 - (fStack_147c + fStack_110c) * fVar210) *
                   local_1378;
              local_12b8 = local_10f8 - fVar195;
              fStack_12b4 = fStack_10f4 - fVar207;
              fStack_12b0 = fStack_10f0 - fVar227;
              fStack_12ac = fStack_10ec - fVar126;
              local_ff8 = local_1108 - local_1428;
              fStack_ff4 = fStack_1104 - fStack_1424;
              fStack_ff0 = fStack_1100 - fStack_1420;
              fStack_fec = fStack_10fc - fStack_141c;
              local_12f8._0_4_ = local_10f8 + fVar195;
              local_12f8._4_4_ = fStack_10f4 + fVar207;
              fStack_12f0 = fStack_10f0 + fVar227;
              fStack_12ec = fStack_10ec + fVar126;
              local_10e8 = local_1108 + local_1428;
              fStack_10e4 = fStack_1104 + fStack_1424;
              fStack_10e0 = fStack_1100 + fStack_1420;
              fStack_10dc = fStack_10fc + fStack_141c;
              fVar182 = local_1118 - fVar217;
              fVar190 = fStack_1114 - fVar101;
              fVar224 = fStack_1110 - fVar193;
              fVar214 = fStack_110c - fVar223;
              local_1328 = fVar217;
              fStack_1324 = fVar101;
              fStack_1320 = fVar193;
              fStack_131c = fVar223;
              local_10d8 = local_1118 + fVar217;
              fStack_10d4 = fStack_1114 + fVar101;
              fStack_10d0 = fStack_1110 + fVar193;
              fStack_10cc = fStack_110c + fVar223;
              fStack_1374 = local_1378;
              fStack_1370 = local_1378;
              fStack_136c = local_1378;
              fStack_12a4 = local_12a8;
              fStack_12a0 = local_12a8;
              fStack_129c = local_12a8;
              auVar81._0_4_ =
                   (local_12b8 * local_10e8 - local_ff8 * (float)local_12f8._0_4_) * local_12a8 +
                   (local_ff8 * local_10d8 - fVar182 * local_10e8) * (float)local_1478._4_4_ +
                   (fVar182 * (float)local_12f8._0_4_ - local_12b8 * local_10d8) * local_1378;
              auVar81._4_4_ =
                   (fStack_12b4 * fStack_10e4 - fStack_ff4 * (float)local_12f8._4_4_) * local_12a8 +
                   (fStack_ff4 * fStack_10d4 - fVar190 * fStack_10e4) * (float)local_1478._4_4_ +
                   (fVar190 * (float)local_12f8._4_4_ - fStack_12b4 * fStack_10d4) * local_1378;
              auVar81._8_4_ =
                   (fStack_12b0 * fStack_10e0 - fStack_ff0 * fStack_12f0) * local_12a8 +
                   (fStack_ff0 * fStack_10d0 - fVar224 * fStack_10e0) * (float)local_1478._4_4_ +
                   (fVar224 * fStack_12f0 - fStack_12b0 * fStack_10d0) * local_1378;
              auVar81._12_4_ =
                   (fStack_12ac * fStack_10dc - fStack_fec * fStack_12ec) * local_12a8 +
                   (fStack_fec * fStack_10cc - fVar214 * fStack_10dc) * (float)local_1478._4_4_ +
                   (fVar214 * fStack_12ec - fStack_12ac * fStack_10cc) * local_1378;
              local_1278._0_4_ = local_1008 + auVar233._0_4_ + auVar81._0_4_;
              local_1278._4_4_ = fStack_1004 + auVar233._4_4_ + auVar81._4_4_;
              local_1278._8_4_ = fStack_1000 + auVar233._8_4_ + auVar81._8_4_;
              local_1278._12_4_ = fStack_ffc + auVar233._12_4_ + auVar81._12_4_;
              auVar132._4_4_ = fStack_1004;
              auVar132._0_4_ = local_1008;
              auVar132._8_4_ = fStack_1000;
              auVar132._12_4_ = fStack_ffc;
              auVar219 = minps(auVar132,auVar233);
              auVar219 = minps(auVar219,auVar81);
              auVar175._4_4_ = fStack_1004;
              auVar175._0_4_ = local_1008;
              auVar175._8_4_ = fStack_1000;
              auVar175._12_4_ = fStack_ffc;
              auVar176 = maxps(auVar175,auVar233);
              auVar176 = maxps(auVar176,auVar81);
              fVar222 = ABS(local_1278._0_4_);
              fVar172 = ABS(local_1278._4_4_);
              fVar194 = ABS(local_1278._8_4_);
              fVar125 = ABS(local_1278._12_4_);
              auVar177._0_4_ =
                   -(uint)(auVar176._0_4_ <= fVar222 * 1.1920929e-07 ||
                          -(fVar222 * 1.1920929e-07) <= auVar219._0_4_) & local_1128;
              auVar177._4_4_ =
                   -(uint)(auVar176._4_4_ <= fVar172 * 1.1920929e-07 ||
                          -(fVar172 * 1.1920929e-07) <= auVar219._4_4_) & uStack_1124;
              auVar177._8_4_ =
                   -(uint)(auVar176._8_4_ <= fVar194 * 1.1920929e-07 ||
                          -(fVar194 * 1.1920929e-07) <= auVar219._8_4_) & uStack_1120;
              auVar177._12_4_ =
                   -(uint)(auVar176._12_4_ <= fVar125 * 1.1920929e-07 ||
                          -(fVar125 * 1.1920929e-07) <= auVar219._12_4_) & uStack_111c;
              uVar123 = movmskps((int)lVar51,auVar177);
              local_12c8 = ZEXT416(uVar124);
              local_12d8 = ZEXT416((uint)fStack_1384);
              lVar50 = local_13a8;
              lVar61 = local_13b8;
              if (uVar123 != 0) {
                local_1028 = fVar222;
                fStack_1024 = fVar172;
                fStack_1020 = fVar194;
                fStack_101c = fVar125;
                local_1018 = auVar233;
                auVar234._0_4_ = local_fd8 * fVar191 - local_fc8 * fVar198;
                auVar234._4_4_ = fStack_fd4 * fVar192 - fStack_fc4 * fVar208;
                auVar234._8_4_ = fStack_fd0 * fVar196 - fStack_fc0 * fVar209;
                auVar234._12_4_ = fStack_fcc * fVar197 - fStack_fbc * fVar210;
                auVar231._0_4_ = fVar198 * local_ff8 - fVar191 * local_12b8;
                auVar231._4_4_ = fVar208 * fStack_ff4 - fVar192 * fStack_12b4;
                auVar231._8_4_ = fVar209 * fStack_ff0 - fVar196 * fStack_12b0;
                auVar231._12_4_ = fVar210 * fStack_fec - fVar197 * fStack_12ac;
                auVar82._4_4_ = -(uint)(ABS(fStack_fc4 * fVar208) < ABS(fVar192 * fStack_12b4));
                auVar82._0_4_ = -(uint)(ABS(local_fc8 * fVar198) < ABS(fVar191 * local_12b8));
                auVar82._8_4_ = -(uint)(ABS(fStack_fc0 * fVar209) < ABS(fVar196 * fStack_12b0));
                auVar82._12_4_ = -(uint)(ABS(fStack_fbc * fVar210) < ABS(fVar197 * fStack_12ac));
                local_1218 = blendvps(auVar231,auVar234,auVar82);
                auVar107._0_4_ = local_fc8 * fVar170 - local_fe8 * fVar191;
                auVar107._4_4_ = fStack_fc4 * fVar171 - fStack_fe4 * fVar192;
                auVar107._8_4_ = fStack_fc0 * fVar226 - fStack_fe0 * fVar196;
                auVar107._12_4_ = fStack_fbc * fVar183 - fStack_fdc * fVar197;
                auVar228._0_4_ = fVar191 * fVar182 - fVar170 * local_ff8;
                auVar228._4_4_ = fVar192 * fVar190 - fVar171 * fStack_ff4;
                auVar228._8_4_ = fVar196 * fVar224 - fVar226 * fStack_ff0;
                auVar228._12_4_ = fVar197 * fVar214 - fVar183 * fStack_fec;
                auVar83._4_4_ = -(uint)(ABS(fStack_fe4 * fVar192) < ABS(fVar171 * fStack_ff4));
                auVar83._0_4_ = -(uint)(ABS(local_fe8 * fVar191) < ABS(fVar170 * local_ff8));
                auVar83._8_4_ = -(uint)(ABS(fStack_fe0 * fVar196) < ABS(fVar226 * fStack_ff0));
                auVar83._12_4_ = -(uint)(ABS(fStack_fdc * fVar197) < ABS(fVar183 * fStack_fec));
                local_1208 = blendvps(auVar228,auVar107,auVar83);
                fVar182 = fVar198 * fVar182;
                fVar190 = fVar208 * fVar190;
                auVar236._0_4_ = local_fe8 * fVar198 - local_fd8 * fVar170;
                auVar236._4_4_ = fStack_fe4 * fVar208 - fStack_fd4 * fVar171;
                auVar236._8_4_ = fStack_fe0 * fVar209 - fStack_fd0 * fVar226;
                auVar236._12_4_ = fStack_fdc * fVar210 - fStack_fcc * fVar183;
                auVar187._0_4_ = fVar170 * local_12b8 - fVar182;
                auVar187._4_4_ = fVar171 * fStack_12b4 - fVar190;
                auVar187._8_4_ = fVar226 * fStack_12b0 - fVar209 * fVar224;
                auVar187._12_4_ = fVar183 * fStack_12ac - fVar210 * fVar214;
                auVar200._0_8_ = CONCAT44(fVar190,fVar182) & 0x7fffffff7fffffff;
                auVar200._8_4_ = ABS(fVar209 * fVar224);
                auVar200._12_4_ = ABS(fVar210 * fVar214);
                auVar84._4_4_ = -(uint)(ABS(fStack_fd4 * fVar171) < ABS(fVar190));
                auVar84._0_4_ = -(uint)(ABS(local_fd8 * fVar170) < ABS(fVar182));
                auVar84._8_4_ = -(uint)(ABS(fStack_fd0 * fVar226) < auVar200._8_4_);
                auVar84._12_4_ = -(uint)(ABS(fStack_fcc * fVar183) < auVar200._12_4_);
                local_11f8 = blendvps(auVar187,auVar236,auVar84);
                fVar182 = local_12a8 * local_1218._0_4_ +
                          (float)local_1478._4_4_ * local_1208._0_4_ + local_1378 * local_11f8._0_4_
                ;
                fVar224 = local_12a8 * local_1218._4_4_ +
                          (float)local_1478._4_4_ * local_1208._4_4_ + local_1378 * local_11f8._4_4_
                ;
                fVar214 = local_12a8 * local_1218._8_4_ +
                          (float)local_1478._4_4_ * local_1208._8_4_ + local_1378 * local_11f8._8_4_
                ;
                fVar170 = local_12a8 * local_1218._12_4_ +
                          (float)local_1478._4_4_ * local_1208._12_4_ +
                          local_1378 * local_11f8._12_4_;
                auVar85._0_4_ = fVar182 + fVar182;
                auVar85._4_4_ = fVar224 + fVar224;
                auVar85._8_4_ = fVar214 + fVar214;
                auVar85._12_4_ = fVar170 + fVar170;
                auVar108._0_4_ = local_fa8 * local_11f8._0_4_;
                auVar108._4_4_ = fStack_fa4 * local_11f8._4_4_;
                auVar108._8_4_ = fStack_fa0 * local_11f8._8_4_;
                auVar108._12_4_ = fStack_f9c * local_11f8._12_4_;
                fVar171 = fVar211 * local_1218._0_4_ + local_fb8 * local_1208._0_4_ + auVar108._0_4_
                ;
                fVar226 = fVar212 * local_1218._4_4_ +
                          fStack_fb4 * local_1208._4_4_ + auVar108._4_4_;
                fVar183 = fStack_1480 * local_1218._8_4_ +
                          fStack_fb0 * local_1208._8_4_ + auVar108._8_4_;
                fVar191 = fStack_147c * local_1218._12_4_ +
                          fStack_fac * local_1208._12_4_ + auVar108._12_4_;
                auVar219 = rcpps(auVar108,auVar85);
                fVar182 = auVar219._0_4_;
                fVar224 = auVar219._4_4_;
                fVar214 = auVar219._8_4_;
                fVar170 = auVar219._12_4_;
                auVar133._0_4_ =
                     ((1.0 - auVar85._0_4_ * fVar182) * fVar182 + fVar182) * (fVar171 + fVar171);
                auVar133._4_4_ =
                     ((1.0 - auVar85._4_4_ * fVar224) * fVar224 + fVar224) * (fVar226 + fVar226);
                auVar133._8_4_ =
                     ((1.0 - auVar85._8_4_ * fVar214) * fVar214 + fVar214) * (fVar183 + fVar183);
                auVar133._12_4_ =
                     ((1.0 - auVar85._12_4_ * fVar170) * fVar170 + fVar170) * (fVar191 + fVar191);
                fVar182 = *(float *)((long)&local_11b0->leafIntersector + 4);
                iVar68 = -(uint)(fVar182 <= auVar133._4_4_);
                iVar69 = -(uint)(fVar182 <= auVar133._8_4_);
                iVar70 = -(uint)(fVar182 <= auVar133._12_4_);
                auVar148._8_4_ = iVar69;
                auVar148._4_4_ = iVar68;
                auVar148._12_4_ = iVar70;
                auVar86._0_4_ =
                     (int)((uint)((auVar133._0_4_ <= fVar215 && fVar182 <= auVar133._0_4_) &&
                                 auVar85._0_4_ != 0.0) * -0x80000000) >> 0x1f;
                auVar86._4_4_ =
                     (int)((uint)((auVar133._4_4_ <= fVar215 && fVar182 <= auVar133._4_4_) &&
                                 auVar85._4_4_ != 0.0) * -0x80000000) >> 0x1f;
                auVar86._8_4_ =
                     (int)((uint)((auVar133._8_4_ <= fVar215 && fVar182 <= auVar133._8_4_) &&
                                 auVar85._8_4_ != 0.0) * -0x80000000) >> 0x1f;
                auVar86._12_4_ =
                     (int)((uint)((auVar133._12_4_ <= fVar215 && fVar182 <= auVar133._12_4_) &&
                                 auVar85._12_4_ != 0.0) * -0x80000000) >> 0x1f;
                auVar87 = auVar86 & auVar177;
                uVar123 = movmskps(uVar123,auVar87);
                if (uVar123 != 0) {
                  local_1268 = &local_1489;
                  local_1258 = auVar87;
                  local_1228 = auVar133;
                  auVar148._0_4_ = (float)(int)(*(ushort *)(local_13b8 + 8 + local_13a8) - 1);
                  auVar188._4_4_ = iVar68;
                  auVar188._0_4_ = auVar148._0_4_;
                  auVar188._8_4_ = iVar69;
                  auVar188._12_4_ = iVar70;
                  auVar219 = rcpss(auVar188,auVar148);
                  auVar201._4_12_ = auVar200._4_12_;
                  auVar201._0_4_ = (float)(int)(*(ushort *)(local_13b8 + 10 + local_13a8) - 1);
                  fStack_128c = (2.0 - auVar148._0_4_ * auVar219._0_4_) * auVar219._0_4_;
                  auVar189._4_4_ = ABS(fVar190);
                  auVar189._0_4_ = auVar201._0_4_;
                  auVar189._8_4_ = auVar200._8_4_;
                  auVar189._12_4_ = auVar200._12_4_;
                  auVar219 = rcpss(auVar189,auVar201);
                  fVar215 = (2.0 - auVar201._0_4_ * auVar219._0_4_) * auVar219._0_4_;
                  local_1298._0_4_ = fStack_128c * (local_1008 + (float)uVar124 * local_1278._0_4_);
                  local_1298._4_4_ =
                       fStack_128c * (fStack_1004 + (float)(uVar124 + 1) * local_1278._4_4_);
                  fStack_1290 = fStack_128c *
                                (fStack_1000 + (float)(uVar124 + 1) * local_1278._8_4_);
                  fStack_128c = fStack_128c * (fStack_ffc + (float)uVar124 * local_1278._12_4_);
                  auVar169._0_4_ = (float)(int)fStack_1384 * local_1278._0_4_ + auVar233._0_4_;
                  auVar169._4_4_ = (float)(int)fStack_1384 * local_1278._4_4_ + auVar233._4_4_;
                  auVar169._8_4_ = (float)((int)fStack_1384 + 1) * local_1278._8_4_ + auVar233._8_4_
                  ;
                  auVar169._12_4_ =
                       (float)((int)fStack_1384 + 1) * local_1278._12_4_ + auVar233._12_4_;
                  local_1288 = fVar215 * auVar169._0_4_;
                  fStack_1284 = fVar215 * auVar169._4_4_;
                  fStack_1280 = fVar215 * auVar169._8_4_;
                  fStack_127c = fVar215 * auVar169._12_4_;
                  lVar25 = *(long *)(*(long *)(local_1198 + 0x1e8) + (long)pRVar57 * 8);
                  uVar123 = *(uint *)((long)&(local_11b0->intersector1).intersect + 4);
                  context = pRVar57;
                  if ((*(uint *)(lVar25 + 0x34) & uVar123) != 0) {
                    local_1408 = auVar87;
                    auVar219 = rcpps(auVar169,local_1278);
                    fVar182 = auVar219._0_4_;
                    fVar190 = auVar219._4_4_;
                    fVar224 = auVar219._8_4_;
                    fVar214 = auVar219._12_4_;
                    fVar222 = (float)(-(uint)(1e-18 <= fVar222) &
                                     (uint)(((float)DAT_01f46a60 - local_1278._0_4_ * fVar182) *
                                            fVar182 + fVar182));
                    fVar172 = (float)(-(uint)(1e-18 <= fVar172) &
                                     (uint)((DAT_01f46a60._4_4_ - local_1278._4_4_ * fVar190) *
                                            fVar190 + fVar190));
                    fVar194 = (float)(-(uint)(1e-18 <= fVar194) &
                                     (uint)((DAT_01f46a60._8_4_ - local_1278._8_4_ * fVar224) *
                                            fVar224 + fVar224));
                    fVar125 = (float)(-(uint)(1e-18 <= fVar125) &
                                     (uint)((DAT_01f46a60._12_4_ - local_1278._12_4_ * fVar214) *
                                            fVar214 + fVar214));
                    auVar109._0_4_ = (float)local_1298._0_4_ * fVar222;
                    auVar109._4_4_ = (float)local_1298._4_4_ * fVar172;
                    auVar109._8_4_ = fStack_1290 * fVar194;
                    auVar109._12_4_ = fStack_128c * fVar125;
                    local_1248 = minps(auVar109,_DAT_01f46a60);
                    auVar149._0_4_ = fVar215 * auVar169._0_4_ * fVar222;
                    auVar149._4_4_ = fVar215 * auVar169._4_4_ * fVar172;
                    auVar149._8_4_ = fVar215 * auVar169._8_4_ * fVar194;
                    auVar149._12_4_ = fVar215 * auVar169._12_4_ * fVar125;
                    local_1238 = minps(auVar149,_DAT_01f46a60);
                    auVar176 = blendvps(_DAT_01f45a30,auVar133,auVar87);
                    auVar134._4_4_ = auVar176._0_4_;
                    auVar134._0_4_ = auVar176._4_4_;
                    auVar134._8_4_ = auVar176._12_4_;
                    auVar134._12_4_ = auVar176._8_4_;
                    auVar219 = minps(auVar134,auVar176);
                    auVar110._0_8_ = auVar219._8_8_;
                    auVar110._8_4_ = auVar219._0_4_;
                    auVar110._12_4_ = auVar219._4_4_;
                    auVar219 = minps(auVar110,auVar219);
                    auVar111._0_8_ =
                         CONCAT44(-(uint)(auVar219._4_4_ == auVar176._4_4_) & auVar87._4_4_,
                                  -(uint)(auVar219._0_4_ == auVar176._0_4_) & auVar87._0_4_);
                    auVar111._8_4_ = -(uint)(auVar219._8_4_ == auVar176._8_4_) & auVar87._8_4_;
                    auVar111._12_4_ = -(uint)(auVar219._12_4_ == auVar176._12_4_) & auVar87._12_4_;
                    iVar68 = movmskps(uVar123,auVar111);
                    if (iVar68 != 0) {
                      auVar87._8_4_ = auVar111._8_4_;
                      auVar87._0_8_ = auVar111._0_8_;
                      auVar87._12_4_ = auVar111._12_4_;
                    }
                    uVar123 = movmskps(iVar68,auVar87);
                    lVar50 = 0;
                    if (uVar123 != 0) {
                      for (; (uVar123 >> lVar50 & 1) == 0; lVar50 = lVar50 + 1) {
                      }
                    }
                    pbVar28 = *(byte **)&(local_13f0->super_RayK<1>).dir.field_0;
                    if ((*(long *)(pbVar28 + 0x10) == 0) && (*(long *)(lVar25 + 0x40) == 0)) {
                      uVar55 = *(undefined4 *)(local_1248 + lVar50 * 4);
                      uVar17 = *(undefined4 *)(local_1238 + lVar50 * 4);
                      uVar18 = *(undefined4 *)(local_1218 + lVar50 * 4);
                      uVar19 = *(undefined4 *)(local_1208 + lVar50 * 4);
                      uVar20 = *(undefined4 *)(local_11f8 + lVar50 * 4);
                      *(undefined4 *)&(local_11b0->intersector1).intersect =
                           *(undefined4 *)(local_1228 + lVar50 * 4);
                      *(undefined4 *)&(local_11b0->intersector1).pointQuery = uVar18;
                      *(undefined4 *)((long)&(local_11b0->intersector1).pointQuery + 4) = uVar19;
                      *(undefined4 *)&(local_11b0->intersector1).name = uVar20;
                      *(undefined4 *)((long)&(local_11b0->intersector1).name + 4) = uVar55;
                      *(undefined4 *)&(local_11b0->intersector4).intersect = uVar17;
                      *(uint *)((long)&(local_11b0->intersector4).intersect + 4) = uVar122;
                      *(uint *)&(local_11b0->intersector4).occluded = uVar54;
                      puVar29 = *(uint **)((long)&(local_13f0->super_RayK<1>).org.field_0 + 8);
                      uVar54 = *puVar29;
                      pRVar57 = (RayQueryContext *)(ulong)uVar54;
                      *(uint *)((long)&(local_11b0->intersector4).occluded + 4) = uVar54;
                      uVar123 = puVar29[1];
                      *(uint *)&(local_11b0->intersector4).name = uVar123;
                    }
                    else {
                      puVar64 = *(undefined4 **)((long)&(local_13f0->super_RayK<1>).org.field_0 + 8)
                      ;
                      _local_1478 = ZEXT416(*(uint *)&(local_11b0->intersector1).intersect);
                      _local_1488 = auVar133;
                      _local_12e8 = auVar113;
LAB_006b58e9:
                      local_135c = *(undefined4 *)(local_1248 + lVar50 * 4);
                      local_1358 = *(undefined4 *)(local_1238 + lVar50 * 4);
                      *(undefined4 *)&(pIVar48->intersector1).intersect =
                           *(undefined4 *)(local_1228 + lVar50 * 4);
                      local_1368 = *(float *)(local_1218 + lVar50 * 4);
                      local_1364 = *(undefined4 *)(local_1208 + lVar50 * 4);
                      local_1360 = *(undefined4 *)(local_11f8 + lVar50 * 4);
                      local_1354 = (int)local_1464._20_8_;
                      local_1350 = (int)local_1464._4_8_;
                      local_134c = *puVar64;
                      local_1348 = puVar64[1];
                      local_1464._0_4_ = 0xffffffff;
                      local_13e8[0] = (Intersectors *)local_1464;
                      local_13e8[1] = (Intersectors *)*(undefined8 *)(lVar25 + 0x18);
                      local_13d8 = puVar64;
                      local_13d0 = pIVar48;
                      local_13c8 = &local_1368;
                      local_13c0 = 1;
                      local_1438 = fVar178;
                      if (*(code **)(lVar25 + 0x40) == (code *)0x0) {
LAB_006b59f3:
                        if ((*(code **)(pbVar28 + 0x10) != (code *)0x0) &&
                           (((*pbVar28 & 2) != 0 || ((*(byte *)(lVar25 + 0x3e) & 0x40) != 0)))) {
                          (**(code **)(pbVar28 + 0x10))(local_13e8);
                          auVar133 = _local_1488;
                          fVar178 = local_1438;
                          if (*(int *)&local_13e8[0]->ptr == 0) goto LAB_006b5a7f;
                        }
                        *(float *)&(local_13d0->intersector1).pointQuery = *local_13c8;
                        *(float *)((long)&(local_13d0->intersector1).pointQuery + 4) = local_13c8[1]
                        ;
                        *(float *)&(local_13d0->intersector1).name = local_13c8[2];
                        *(float *)((long)&(local_13d0->intersector1).name + 4) = local_13c8[3];
                        *(float *)&(local_13d0->intersector4).intersect = local_13c8[4];
                        *(float *)((long)&(local_13d0->intersector4).intersect + 4) = local_13c8[5];
                        *(float *)&(local_13d0->intersector4).occluded = local_13c8[6];
                        *(float *)((long)&(local_13d0->intersector4).occluded + 4) = local_13c8[7];
                        pRVar57 = (RayQueryContext *)(ulong)(uint)local_13c8[8];
                        *(float *)&(local_13d0->intersector4).name = local_13c8[8];
                        pIVar53 = local_13d0;
                        fVar178 = local_1438;
                      }
                      else {
                        (**(code **)(lVar25 + 0x40))(local_13e8);
                        auVar133 = _local_1488;
                        fVar178 = local_1438;
                        if (*(int *)&local_13e8[0]->ptr != 0) goto LAB_006b59f3;
LAB_006b5a7f:
                        *(undefined4 *)&(pIVar48->intersector1).intersect = local_1478._0_4_;
                        pIVar53 = local_13e8[0];
                        auVar133 = _local_1488;
                      }
                      *(undefined4 *)(local_1408 + lVar50 * 4) = 0;
                      pIVar14 = &pIVar48->intersector1;
                      fVar102 = *(float *)&pIVar14->intersect;
                      local_1478 = (undefined1  [8])pIVar14->intersect;
                      unique0x10002d56 = pIVar14->occluded;
                      auVar93._0_4_ = -(uint)(auVar133._0_4_ <= fVar102) & local_1408._0_4_;
                      auVar93._4_4_ = -(uint)(auVar133._4_4_ <= fVar102) & local_1408._4_4_;
                      auVar93._8_4_ = -(uint)(auVar133._8_4_ <= fVar102) & local_1408._8_4_;
                      auVar93._12_4_ = -(uint)(auVar133._12_4_ <= fVar102) & local_1408._12_4_;
                      local_1408 = auVar93;
                      iVar68 = movmskps((int)pIVar53,auVar93);
                      if (iVar68 != 0) {
                        auVar113 = blendvps(_DAT_01f45a30,auVar133,auVar93);
                        auVar153._4_4_ = auVar113._0_4_;
                        auVar153._0_4_ = auVar113._4_4_;
                        auVar153._8_4_ = auVar113._12_4_;
                        auVar153._12_4_ = auVar113._8_4_;
                        auVar219 = minps(auVar153,auVar113);
                        auVar118._0_8_ = auVar219._8_8_;
                        auVar118._8_4_ = auVar219._0_4_;
                        auVar118._12_4_ = auVar219._4_4_;
                        auVar219 = minps(auVar118,auVar219);
                        auVar119._0_8_ =
                             CONCAT44(-(uint)(auVar219._4_4_ == auVar113._4_4_) & auVar93._4_4_,
                                      -(uint)(auVar219._0_4_ == auVar113._0_4_) & auVar93._0_4_);
                        auVar119._8_4_ = -(uint)(auVar219._8_4_ == auVar113._8_4_) & auVar93._8_4_;
                        auVar119._12_4_ =
                             -(uint)(auVar219._12_4_ == auVar113._12_4_) & auVar93._12_4_;
                        iVar68 = movmskps(iVar68,auVar119);
                        if (iVar68 != 0) {
                          auVar93._8_4_ = auVar119._8_4_;
                          auVar93._0_8_ = auVar119._0_8_;
                          auVar93._12_4_ = auVar119._12_4_;
                        }
                        uVar55 = movmskps(iVar68,auVar93);
                        uVar59 = CONCAT44((int)((ulong)pIVar53 >> 0x20),uVar55);
                        lVar50 = 0;
                        if (uVar59 != 0) {
                          for (; (uVar59 >> lVar50 & 1) == 0; lVar50 = lVar50 + 1) {
                          }
                        }
                        goto LAB_006b58e9;
                      }
                      local_1464._28_4_ = *(undefined4 *)&pIVar48->ptr;
                      fVar102 = *(float *)((long)&pIVar48->ptr + 4);
                      fVar218 = *(float *)&pIVar48->leafIntersector;
                      local_12a8 = *(float *)&(pIVar48->collider).collide;
                      local_1478._4_4_ = *(float *)((long)&(pIVar48->collider).collide + 4);
                      local_1378 = *(float *)&(pIVar48->collider).name;
                      fStack_12a4 = local_12a8;
                      fStack_12a0 = local_12a8;
                      fStack_129c = local_12a8;
                      fVar217 = (float)local_1088 - (float)local_1464._28_4_;
                      fVar101 = local_1088._4_4_ - (float)local_1464._28_4_;
                      fVar193 = fStack_1080 - (float)local_1464._28_4_;
                      fVar223 = fStack_107c - (float)local_1464._28_4_;
                      fVar195 = local_1078 - fVar102;
                      fVar207 = fStack_1074 - fVar102;
                      fVar227 = fStack_1070 - fVar102;
                      fVar126 = fStack_106c - fVar102;
                      local_1428 = local_1048 - fVar218;
                      fStack_1424 = fStack_1044 - fVar218;
                      fStack_1420 = fStack_1040 - fVar218;
                      fStack_141c = fStack_103c - fVar218;
                      local_10d8 = fVar217 + ((float)local_12e8._0_4_ - (float)local_1464._28_4_);
                      fStack_10d4 = fVar101 + ((float)local_12e8._4_4_ - (float)local_1464._28_4_);
                      fStack_10d0 = fVar193 + (fStack_12e0 - (float)local_1464._28_4_);
                      fStack_10cc = fVar223 + (fStack_12dc - (float)local_1464._28_4_);
                      local_12f8._4_4_ = fVar207 + (fStack_1064 - fVar102);
                      local_12f8._0_4_ = fVar195 + (local_1068 - fVar102);
                      fStack_12f0 = fVar227 + (fStack_1060 - fVar102);
                      fStack_12ec = fVar126 + (fStack_105c - fVar102);
                      local_10e8 = local_1428 + ((float)local_1058 - fVar218);
                      fStack_10e4 = fStack_1424 + (local_1058._4_4_ - fVar218);
                      fStack_10e0 = fStack_1420 + (fStack_1050 - fVar218);
                      fStack_10dc = fStack_141c + (fStack_104c - fVar218);
                      local_1108 = (float)local_1058 - fVar218;
                      fStack_1104 = local_1058._4_4_ - fVar218;
                      fStack_1100 = fStack_1050 - fVar218;
                      fStack_10fc = fStack_104c - fVar218;
                      local_10f8 = local_1068 - fVar102;
                      fStack_10f4 = fStack_1064 - fVar102;
                      fStack_10f0 = fStack_1060 - fVar102;
                      fStack_10ec = fStack_105c - fVar102;
                      local_1118 = (float)local_12e8._0_4_ - (float)local_1464._28_4_;
                      fStack_1114 = (float)local_12e8._4_4_ - (float)local_1464._28_4_;
                      fStack_1110 = fStack_12e0 - (float)local_1464._28_4_;
                      fStack_110c = fStack_12dc - (float)local_1464._28_4_;
                      uVar123 = 0;
                    }
                    local_1478._0_4_ = local_1478._4_4_;
                    fStack_1470 = (float)local_1478._4_4_;
                    fStack_146c = (float)local_1478._4_4_;
                    fStack_1374 = local_1378;
                    fStack_1370 = local_1378;
                    fStack_136c = local_1378;
                    context = pRVar57;
                    lVar50 = local_13a8;
                    lVar61 = local_13b8;
                  }
                }
              }
              fVar178 = fVar178 - fVar218;
              fStack_1434 = fStack_1434 - fVar218;
              fStack_1430 = fStack_1430 - fVar218;
              fStack_142c = fStack_142c - fVar218;
              local_1398 = local_1398 - fVar102;
              fStack_1394 = fStack_1394 - fVar102;
              fStack_1390 = fStack_1390 - fVar102;
              fStack_138c = fStack_138c - fVar102;
              local_1388 = local_1388 - (float)local_1464._28_4_;
              fStack_1384 = fStack_1384 - (float)local_1464._28_4_;
              fStack_1380 = fStack_1380 - (float)local_1464._28_4_;
              fStack_137c = fStack_137c - (float)local_1464._28_4_;
              local_13a8._0_4_ = local_1118 - local_1388;
              local_13a8._4_4_ = fStack_1114 - fStack_1384;
              fStack_13a0 = fStack_1110 - fStack_1380;
              fStack_139c = fStack_110c - fStack_137c;
              fVar171 = local_10f8 - local_1398;
              fVar183 = fStack_10f4 - fStack_1394;
              fVar192 = fStack_10f0 - fStack_1390;
              fVar197 = fStack_10ec - fStack_138c;
              local_1418 = local_1108 - fVar178;
              fStack_1414 = fStack_1104 - fStack_1434;
              fStack_1410 = fStack_1100 - fStack_1430;
              fStack_140c = fStack_10fc - fStack_142c;
              local_1464._28_4_ = fVar195 - local_10f8;
              fStack_1444 = fVar207 - fStack_10f4;
              fStack_1440 = fVar227 - fStack_10f0;
              fStack_143c = fVar126 - fStack_10ec;
              fVar215 = local_1428 - local_1108;
              fVar194 = fStack_1424 - fStack_1104;
              fVar125 = fStack_1420 - fStack_1100;
              fVar182 = fStack_141c - fStack_10fc;
              local_12b8 = fVar217 - local_1118;
              fStack_12b4 = fVar101 - fStack_1114;
              fStack_12b0 = fVar193 - fStack_1110;
              fStack_12ac = fVar223 - fStack_110c;
              local_1488._4_4_ = fVar183;
              local_1488._0_4_ = fVar171;
              fStack_1480 = fVar192;
              fStack_147c = fVar197;
              fVar226 = local_1398 - fVar195;
              fVar191 = fStack_1394 - fVar207;
              fVar196 = fStack_1390 - fVar227;
              fVar198 = fStack_138c - fVar126;
              local_1438._0_2_ = SUB42(fVar178,0);
              local_1438._2_2_ = (undefined2)((uint)fVar178 >> 0x10);
              fVar208 = fVar178 - local_1428;
              fVar209 = fStack_1434 - fStack_1424;
              fVar210 = fStack_1430 - fStack_1420;
              fVar211 = fStack_142c - fStack_141c;
              local_13b8._0_4_ =
                   (fVar171 * (local_1108 + fVar178) - local_1418 * (local_10f8 + local_1398)) *
                   fStack_129c +
                   (local_1418 * (local_1118 + local_1388) -
                   (local_1108 + fVar178) * (float)local_13a8) * (float)local_1478._0_4_ +
                   ((local_10f8 + local_1398) * (float)local_13a8 -
                   (local_1118 + local_1388) * fVar171) * fStack_1374;
              local_13b8._4_4_ =
                   (fVar183 * (fStack_1104 + fStack_1434) -
                   fStack_1414 * (fStack_10f4 + fStack_1394)) * fStack_129c +
                   (fStack_1414 * (fStack_1114 + fStack_1384) -
                   (fStack_1104 + fStack_1434) * local_13a8._4_4_) * (float)local_1478._4_4_ +
                   ((fStack_10f4 + fStack_1394) * local_13a8._4_4_ -
                   (fStack_1114 + fStack_1384) * fVar183) * fStack_1374;
              fStack_13b0 = (fVar192 * (fStack_1100 + fStack_1430) -
                            fStack_1410 * (fStack_10f0 + fStack_1390)) * fStack_129c +
                            (fStack_1410 * (fStack_1110 + fStack_1380) -
                            (fStack_1100 + fStack_1430) * fStack_13a0) * fStack_1470 +
                            ((fStack_10f0 + fStack_1390) * fStack_13a0 -
                            (fStack_1110 + fStack_1380) * fVar192) * fStack_1374;
              fStack_13ac = (fVar197 * (fStack_10fc + fStack_142c) -
                            fStack_140c * (fStack_10ec + fStack_138c)) * fStack_129c +
                            (fStack_140c * (fStack_110c + fStack_137c) -
                            (fStack_10fc + fStack_142c) * fStack_139c) * fStack_146c +
                            ((fStack_10ec + fStack_138c) * fStack_139c -
                            (fStack_110c + fStack_137c) * fVar197) * fStack_1374;
              fVar190 = local_1388 - fVar217;
              fVar224 = fStack_1384 - fVar101;
              fVar214 = fStack_1380 - fVar193;
              fVar170 = fStack_137c - fVar223;
              local_12e8._0_4_ =
                   (fVar226 * (local_1428 + fVar178) - fVar208 * (fVar195 + local_1398)) *
                   fStack_129c +
                   (fVar208 * (fVar217 + local_1388) - (local_1428 + fVar178) * fVar190) *
                   (float)local_1478._0_4_ +
                   ((fVar195 + local_1398) * fVar190 - (fVar217 + local_1388) * fVar226) *
                   fStack_1374;
              local_12e8._4_4_ =
                   (fVar191 * (fStack_1424 + fStack_1434) - fVar209 * (fVar207 + fStack_1394)) *
                   fStack_129c +
                   (fVar209 * (fVar101 + fStack_1384) - (fStack_1424 + fStack_1434) * fVar224) *
                   (float)local_1478._4_4_ +
                   ((fVar207 + fStack_1394) * fVar224 - (fVar101 + fStack_1384) * fVar191) *
                   fStack_1374;
              fStack_12e0 = (fVar196 * (fStack_1420 + fStack_1430) -
                            fVar210 * (fVar227 + fStack_1390)) * fStack_129c +
                            (fVar210 * (fVar193 + fStack_1380) -
                            (fStack_1420 + fStack_1430) * fVar214) * fStack_1470 +
                            ((fVar227 + fStack_1390) * fVar214 - (fVar193 + fStack_1380) * fVar196)
                            * fStack_1374;
              fStack_12dc = (fVar198 * (fStack_141c + fStack_142c) -
                            fVar211 * (fVar126 + fStack_138c)) * fStack_129c +
                            (fVar211 * (fVar223 + fStack_137c) -
                            (fStack_141c + fStack_142c) * fVar170) * fStack_146c +
                            ((fVar126 + fStack_138c) * fVar170 - (fVar223 + fStack_137c) * fVar198)
                            * fStack_1374;
              local_1428 = fVar215;
              fStack_1424 = fVar194;
              fStack_1420 = fVar125;
              fStack_141c = fVar182;
              auVar88._0_4_ =
                   ((float)local_1464._28_4_ * local_10e8 - fVar215 * (float)local_12f8._0_4_) *
                   fStack_129c +
                   (fVar215 * local_10d8 - local_10e8 * local_12b8) * (float)local_1478._0_4_ +
                   ((float)local_12f8._0_4_ * local_12b8 - local_10d8 * (float)local_1464._28_4_) *
                   fStack_1374;
              auVar88._4_4_ =
                   (fStack_1444 * fStack_10e4 - fVar194 * (float)local_12f8._4_4_) * fStack_129c +
                   (fVar194 * fStack_10d4 - fStack_10e4 * fStack_12b4) * (float)local_1478._4_4_ +
                   ((float)local_12f8._4_4_ * fStack_12b4 - fStack_10d4 * fStack_1444) * fStack_1374
              ;
              auVar88._8_4_ =
                   (fStack_1440 * fStack_10e0 - fVar125 * fStack_12f0) * fStack_129c +
                   (fVar125 * fStack_10d0 - fStack_10e0 * fStack_12b0) * fStack_1470 +
                   (fStack_12f0 * fStack_12b0 - fStack_10d0 * fStack_1440) * fStack_1374;
              auVar88._12_4_ =
                   (fStack_143c * fStack_10dc - fVar182 * fStack_12ec) * fStack_129c +
                   (fVar182 * fStack_10cc - fStack_10dc * fStack_12ac) * fStack_146c +
                   (fStack_12ec * fStack_12ac - fStack_10cc * fStack_143c) * fStack_1374;
              local_1278._0_4_ = (float)local_13b8 + (float)local_12e8._0_4_ + auVar88._0_4_;
              local_1278._4_4_ = local_13b8._4_4_ + (float)local_12e8._4_4_ + auVar88._4_4_;
              local_1278._8_4_ = fStack_13b0 + fStack_12e0 + auVar88._8_4_;
              local_1278._12_4_ = fStack_13ac + fStack_12dc + auVar88._12_4_;
              uVar59 = CONCAT44(local_1278._4_4_,local_1278._0_4_);
              local_12f8 = (undefined1  [8])(uVar59 & 0x7fffffff7fffffff);
              fStack_12f0 = ABS(local_1278._8_4_);
              fStack_12ec = ABS(local_1278._12_4_);
              auVar135._4_4_ = local_13b8._4_4_;
              auVar135._0_4_ = (float)local_13b8;
              auVar135._8_4_ = fStack_13b0;
              auVar135._12_4_ = fStack_13ac;
              auVar219 = minps(auVar135,_local_12e8);
              auVar176 = minps(auVar219,auVar88);
              auVar112._4_4_ = local_13b8._4_4_;
              auVar112._0_4_ = (float)local_13b8;
              auVar112._8_4_ = fStack_13b0;
              auVar112._12_4_ = fStack_13ac;
              auVar219 = maxps(auVar112,_local_12e8);
              auVar113 = maxps(auVar219,auVar88);
              auVar219 = _local_12f8;
              auVar114._4_4_ = -(uint)(auVar113._4_4_ <= ABS(local_1278._4_4_) * 1.1920929e-07);
              auVar114._0_4_ = -(uint)(auVar113._0_4_ <= ABS(local_1278._0_4_) * 1.1920929e-07);
              auVar114._8_4_ = -(uint)(auVar113._8_4_ <= fStack_12f0 * 1.1920929e-07);
              auVar114._12_4_ = -(uint)(auVar113._12_4_ <= fStack_12ec * 1.1920929e-07);
              auVar136._4_4_ = -(uint)(-(ABS(local_1278._4_4_) * 1.1920929e-07) <= auVar176._4_4_);
              auVar136._0_4_ = -(uint)(-(ABS(local_1278._0_4_) * 1.1920929e-07) <= auVar176._0_4_);
              auVar136._8_4_ = -(uint)(-(fStack_12f0 * 1.1920929e-07) <= auVar176._8_4_);
              auVar136._12_4_ = -(uint)(-(fStack_12ec * 1.1920929e-07) <= auVar176._12_4_);
              auVar114 = auVar114 | auVar136;
              auVar115._0_4_ = auVar114._0_4_ & local_1128;
              auVar115._4_4_ = auVar114._4_4_ & uStack_1124;
              auVar115._8_4_ = auVar114._8_4_ & uStack_1120;
              auVar115._12_4_ = auVar114._12_4_ & uStack_111c;
              iVar68 = movmskps(uVar123,auVar115);
              uVar59 = local_11c8;
              pauVar62 = local_11a8;
              uVar60 = local_11b8;
              uVar63 = local_11c0;
              This = pIVar48;
              ray = pRVar47;
              uVar66 = local_1464._12_8_;
              fVar102 = fStack_1030;
              fVar222 = fStack_102c;
              fVar218 = local_11e8;
              fVar217 = fStack_11e4;
              fVar101 = fStack_11e0;
              fVar172 = fStack_11dc;
              if (iVar68 != 0) {
                local_1488._4_4_ = fVar183 * fVar209 - fStack_1414 * fVar191;
                local_1488._0_4_ = fVar171 * fVar208 - local_1418 * fVar226;
                fStack_1480 = fVar192 * fVar210 - fStack_1410 * fVar196;
                fStack_147c = fVar197 * fVar211 - fStack_140c * fVar198;
                auVar235._0_4_ = fVar226 * fVar215 - fVar208 * (float)local_1464._28_4_;
                auVar235._4_4_ = fVar191 * fVar194 - fVar209 * fStack_1444;
                auVar235._8_4_ = fVar196 * fVar125 - fVar210 * fStack_1440;
                auVar235._12_4_ = fVar198 * fVar182 - fVar211 * fStack_143c;
                uVar54 = (uint)DAT_01f46710;
                uVar122 = DAT_01f46710._4_4_;
                uVar123 = DAT_01f46710._8_4_;
                uVar124 = DAT_01f46710._12_4_;
                auVar89._4_4_ =
                     -(uint)((float)((uint)(fStack_1414 * fVar191) & uVar122) <
                            (float)((uint)(fVar209 * fStack_1444) & uVar122));
                auVar89._0_4_ =
                     -(uint)((float)((uint)(local_1418 * fVar226) & uVar54) <
                            (float)((uint)(fVar208 * (float)local_1464._28_4_) & uVar54));
                auVar89._8_4_ =
                     -(uint)((float)((uint)(fStack_1410 * fVar196) & uVar123) <
                            (float)((uint)(fVar210 * fStack_1440) & uVar123));
                auVar89._12_4_ =
                     -(uint)((float)((uint)(fStack_140c * fVar198) & uVar124) <
                            (float)((uint)(fVar211 * fStack_143c) & uVar124));
                local_1218 = blendvps(auVar235,_local_1488,auVar89);
                auVar237._0_4_ = fVar208 * local_12b8 - fVar190 * fVar215;
                auVar237._4_4_ = fVar209 * fStack_12b4 - fVar224 * fVar194;
                auVar237._8_4_ = fVar210 * fStack_12b0 - fVar214 * fVar125;
                auVar237._12_4_ = fVar211 * fStack_12ac - fVar170 * fVar182;
                auVar90._4_4_ =
                     -(uint)((float)((uint)(local_13a8._4_4_ * fVar209) & uVar122) <
                            (float)((uint)(fVar224 * fVar194) & uVar122));
                auVar90._0_4_ =
                     -(uint)((float)((uint)((float)local_13a8 * fVar208) & uVar54) <
                            (float)((uint)(fVar190 * fVar215) & uVar54));
                auVar90._8_4_ =
                     -(uint)((float)((uint)(fStack_13a0 * fVar210) & uVar123) <
                            (float)((uint)(fVar214 * fVar125) & uVar123));
                auVar90._12_4_ =
                     -(uint)((float)((uint)(fStack_139c * fVar211) & uVar124) <
                            (float)((uint)(fVar170 * fVar182) & uVar124));
                auVar44._4_4_ = fStack_1414 * fVar224 - local_13a8._4_4_ * fVar209;
                auVar44._0_4_ = local_1418 * fVar190 - (float)local_13a8 * fVar208;
                auVar44._8_4_ = fStack_1410 * fVar214 - fStack_13a0 * fVar210;
                auVar44._12_4_ = fStack_140c * fVar170 - fStack_139c * fVar211;
                local_1208 = blendvps(auVar237,auVar44,auVar90);
                auVar229._0_4_ = (float)local_13a8 * fVar226 - fVar171 * fVar190;
                auVar229._4_4_ = local_13a8._4_4_ * fVar191 - fVar183 * fVar224;
                auVar229._8_4_ = fStack_13a0 * fVar196 - fVar192 * fVar214;
                auVar229._12_4_ = fStack_139c * fVar198 - fVar197 * fVar170;
                auVar225._0_4_ = fVar190 * (float)local_1464._28_4_ - fVar226 * local_12b8;
                auVar225._4_4_ = fVar224 * fStack_1444 - fVar191 * fStack_12b4;
                auVar225._8_4_ = fVar214 * fStack_1440 - fVar196 * fStack_12b0;
                auVar225._12_4_ = fVar170 * fStack_143c - fVar198 * fStack_12ac;
                auVar91._4_4_ =
                     -(uint)((float)((uint)(fVar183 * fVar224) & uVar122) <
                            (float)((uint)(fVar191 * fStack_12b4) & uVar122));
                auVar91._0_4_ =
                     -(uint)((float)((uint)(fVar171 * fVar190) & uVar54) <
                            (float)((uint)(fVar226 * local_12b8) & uVar54));
                auVar91._8_4_ =
                     -(uint)((float)((uint)(fVar192 * fVar214) & uVar123) <
                            (float)((uint)(fVar196 * fStack_12b0) & uVar123));
                auVar91._12_4_ =
                     -(uint)((float)((uint)(fVar197 * fVar170) & uVar124) <
                            (float)((uint)(fVar198 * fStack_12ac) & uVar124));
                local_11f8 = blendvps(auVar225,auVar229,auVar91);
                fVar215 = fStack_129c * local_1218._0_4_ +
                          (float)local_1478._0_4_ * local_1208._0_4_ +
                          fStack_1374 * local_11f8._0_4_;
                fVar193 = fStack_129c * local_1218._4_4_ +
                          (float)local_1478._4_4_ * local_1208._4_4_ +
                          fStack_1374 * local_11f8._4_4_;
                fVar194 = fStack_129c * local_1218._8_4_ +
                          fStack_1470 * local_1208._8_4_ + fStack_1374 * local_11f8._8_4_;
                fVar223 = fStack_129c * local_1218._12_4_ +
                          fStack_146c * local_1208._12_4_ + fStack_1374 * local_11f8._12_4_;
                auVar202._0_4_ = fVar215 + fVar215;
                auVar202._4_4_ = fVar193 + fVar193;
                auVar202._8_4_ = fVar194 + fVar194;
                auVar202._12_4_ = fVar223 + fVar223;
                auVar220._0_4_ = fVar178 * local_11f8._0_4_;
                auVar220._4_4_ = fStack_1434 * local_11f8._4_4_;
                auVar220._8_4_ = fStack_1430 * local_11f8._8_4_;
                auVar220._12_4_ = fStack_142c * local_11f8._12_4_;
                auVar92._0_4_ = local_1398 * local_1208._0_4_ + auVar220._0_4_;
                auVar92._4_4_ = fStack_1394 * local_1208._4_4_ + auVar220._4_4_;
                auVar92._8_4_ = fStack_1390 * local_1208._8_4_ + auVar220._8_4_;
                auVar92._12_4_ = fStack_138c * local_1208._12_4_ + auVar220._12_4_;
                fVar125 = local_1388 * local_1218._0_4_ + auVar92._0_4_;
                fVar195 = fStack_1384 * local_1218._4_4_ + auVar92._4_4_;
                fVar207 = fStack_1380 * local_1218._8_4_ + auVar92._8_4_;
                fVar227 = fStack_137c * local_1218._12_4_ + auVar92._12_4_;
                auVar113 = rcpps(auVar92,auVar202);
                fVar215 = auVar113._0_4_;
                fVar193 = auVar113._4_4_;
                fVar194 = auVar113._8_4_;
                fVar223 = auVar113._12_4_;
                auVar137._0_4_ =
                     ((1.0 - auVar202._0_4_ * fVar215) * fVar215 + fVar215) * (fVar125 + fVar125);
                auVar137._4_4_ =
                     ((1.0 - auVar202._4_4_ * fVar193) * fVar193 + fVar193) * (fVar195 + fVar195);
                auVar137._8_4_ =
                     ((1.0 - auVar202._8_4_ * fVar194) * fVar194 + fVar194) * (fVar207 + fVar207);
                auVar137._12_4_ =
                     ((1.0 - auVar202._12_4_ * fVar223) * fVar223 + fVar223) * (fVar227 + fVar227);
                local_1478 = (undefined1  [8])(pIVar48->intersector1).intersect;
                unique0x00006c88 = (pIVar48->intersector1).occluded;
                fVar193 = SUB84(local_1478,0);
                fVar215 = *(float *)((long)&pIVar48->leafIntersector + 4);
                auVar203._0_4_ =
                     (int)((uint)(auVar202._0_4_ != 0.0 &&
                                 (auVar137._0_4_ <= fVar193 && fVar215 <= auVar137._0_4_)) *
                          -0x80000000) >> 0x1f;
                auVar203._4_4_ =
                     (int)((uint)(auVar202._4_4_ != 0.0 &&
                                 (auVar137._4_4_ <= fVar193 && fVar215 <= auVar137._4_4_)) *
                          -0x80000000) >> 0x1f;
                auVar203._8_4_ =
                     (int)((uint)(auVar202._8_4_ != 0.0 &&
                                 (auVar137._8_4_ <= fVar193 && fVar215 <= auVar137._8_4_)) *
                          -0x80000000) >> 0x1f;
                auVar203._12_4_ =
                     (int)((uint)(auVar202._12_4_ != 0.0 &&
                                 (auVar137._12_4_ <= fVar193 && fVar215 <= auVar137._12_4_)) *
                          -0x80000000) >> 0x1f;
                auVar204 = auVar203 & auVar115;
                iVar68 = movmskps(iVar68,auVar204);
                if (iVar68 != 0) {
                  uVar52 = extractps(_local_1478,1);
                  local_1268 = &local_1489;
                  local_1258 = auVar204;
                  local_1228 = auVar137;
                  auVar150._0_4_ = local_1278._0_4_ - (float)local_12e8._0_4_;
                  auVar150._4_4_ = local_1278._4_4_ - (float)local_12e8._4_4_;
                  auVar150._8_4_ = local_1278._8_4_ - fStack_12e0;
                  auVar150._12_4_ = local_1278._12_4_ - fStack_12dc;
                  auVar116._4_12_ = auVar115._4_12_;
                  auVar116._0_4_ = (float)(int)(*(ushort *)(lVar61 + 8 + lVar50) - 1);
                  auVar205._4_4_ = auVar115._4_4_;
                  auVar205._0_4_ = auVar116._0_4_;
                  auVar205._8_4_ = auVar115._8_4_;
                  auVar205._12_4_ = auVar115._12_4_;
                  auVar113 = rcpss(auVar205,auVar116);
                  auVar221._4_12_ = auVar220._4_12_;
                  auVar221._0_4_ = (float)(int)(*(ushort *)(lVar61 + 10 + lVar50) - 1);
                  fVar215 = (2.0 - auVar116._0_4_ * auVar113._0_4_) * auVar113._0_4_;
                  auVar206._4_4_ = auVar220._4_4_;
                  auVar206._0_4_ = auVar221._0_4_;
                  auVar206._8_4_ = auVar220._8_4_;
                  auVar206._12_4_ = auVar220._12_4_;
                  auVar113 = rcpss(auVar206,auVar221);
                  fStack_127c = (2.0 - auVar221._0_4_ * auVar113._0_4_) * auVar113._0_4_;
                  local_1298._0_4_ =
                       fVar215 * ((float)(int)local_12c8._0_4_ * local_1278._0_4_ +
                                 (local_1278._0_4_ - (float)local_13b8));
                  local_1298._4_4_ =
                       fVar215 * ((float)(local_12c8._0_4_ + 1) * local_1278._4_4_ +
                                 (local_1278._4_4_ - local_13b8._4_4_));
                  fStack_1290 = fVar215 * ((float)(local_12c8._0_4_ + 1) * local_1278._8_4_ +
                                          (local_1278._8_4_ - fStack_13b0));
                  fStack_128c = fVar215 * ((float)(int)local_12c8._0_4_ * local_1278._12_4_ +
                                          (local_1278._12_4_ - fStack_13ac));
                  local_1288 = fStack_127c *
                               ((float)(int)local_12d8._0_4_ * local_1278._0_4_ + auVar150._0_4_);
                  fStack_1284 = fStack_127c *
                                ((float)(int)local_12d8._0_4_ * local_1278._4_4_ + auVar150._4_4_);
                  fStack_1280 = fStack_127c *
                                ((float)(local_12d8._0_4_ + 1) * local_1278._8_4_ + auVar150._8_4_);
                  fStack_127c = fStack_127c *
                                ((float)(local_12d8._0_4_ + 1) * local_1278._12_4_ + auVar150._12_4_
                                );
                  context = *(RayQueryContext **)
                             (*(long *)&(pRVar47->super_RayK<1>).org.field_0 + 0x1e8);
                  pSVar30 = (&context->scene)[local_1464._4_8_];
                  if ((*(uint *)((long)&(pSVar30->super_AccelN).super_Accel.super_AccelData.bounds.
                                        bounds1.lower + 4) & (uint)uVar52) != 0) {
                    local_1408 = auVar204;
                    auVar113 = rcpps(auVar150,local_1278);
                    fVar215 = auVar113._0_4_;
                    fVar193 = auVar113._4_4_;
                    fVar194 = auVar113._8_4_;
                    fVar223 = auVar113._12_4_;
                    local_12f8._4_4_ = (undefined4)((ulong)local_12f8 >> 0x20);
                    fVar215 = (float)(-(uint)(1e-18 <= (float)local_12f8._0_4_) &
                                     (uint)(((float)DAT_01f46a60 - local_1278._0_4_ * fVar215) *
                                            fVar215 + fVar215));
                    fVar193 = (float)(-(uint)(1e-18 <= (float)local_12f8._4_4_) &
                                     (uint)((DAT_01f46a60._4_4_ - local_1278._4_4_ * fVar193) *
                                            fVar193 + fVar193));
                    fVar194 = (float)(-(uint)(1e-18 <= fStack_12f0) &
                                     (uint)((DAT_01f46a60._8_4_ - local_1278._8_4_ * fVar194) *
                                            fVar194 + fVar194));
                    fVar223 = (float)(-(uint)(1e-18 <= fStack_12ec) &
                                     (uint)((DAT_01f46a60._12_4_ - local_1278._12_4_ * fVar223) *
                                            fVar223 + fVar223));
                    auVar230._0_4_ = (float)local_1298._0_4_ * fVar215;
                    auVar230._4_4_ = (float)local_1298._4_4_ * fVar193;
                    auVar230._8_4_ = fStack_1290 * fVar194;
                    auVar230._12_4_ = fStack_128c * fVar223;
                    local_1248 = minps(auVar230,_DAT_01f46a60);
                    auVar117._0_4_ = local_1288 * fVar215;
                    auVar117._4_4_ = fStack_1284 * fVar193;
                    auVar117._8_4_ = fStack_1280 * fVar194;
                    auVar117._12_4_ = fStack_127c * fVar223;
                    local_1238 = minps(auVar117,_DAT_01f46a60);
                    auVar113 = blendvps(_DAT_01f45a30,auVar137,auVar204);
                    auVar138._4_4_ = auVar113._0_4_;
                    auVar138._0_4_ = auVar113._4_4_;
                    auVar138._8_4_ = auVar113._12_4_;
                    auVar138._12_4_ = auVar113._8_4_;
                    auVar176 = minps(auVar138,auVar113);
                    auVar151._0_8_ = auVar176._8_8_;
                    auVar151._8_4_ = auVar176._0_4_;
                    auVar151._12_4_ = auVar176._4_4_;
                    auVar176 = minps(auVar151,auVar176);
                    auVar152._0_8_ =
                         CONCAT44(-(uint)(auVar176._4_4_ == auVar113._4_4_) & auVar204._4_4_,
                                  -(uint)(auVar176._0_4_ == auVar113._0_4_) & auVar204._0_4_);
                    auVar152._8_4_ = -(uint)(auVar176._8_4_ == auVar113._8_4_) & auVar204._8_4_;
                    auVar152._12_4_ = -(uint)(auVar176._12_4_ == auVar113._12_4_) & auVar204._12_4_;
                    iVar68 = movmskps((uint)uVar52,auVar152);
                    if (iVar68 != 0) {
                      auVar204._8_4_ = auVar152._8_4_;
                      auVar204._0_8_ = auVar152._0_8_;
                      auVar204._12_4_ = auVar152._12_4_;
                    }
                    uVar55 = movmskps(iVar68,auVar204);
                    uVar49 = CONCAT44((int)((ulong)uVar52 >> 0x20),uVar55);
                    lVar50 = 0;
                    if (uVar49 != 0) {
                      for (; (uVar49 >> lVar50 & 1) == 0; lVar50 = lVar50 + 1) {
                      }
                    }
                    pbVar28 = *(byte **)&(pRVar47->super_RayK<1>).dir.field_0;
                    auVar113 = auVar137;
                    fStack_1370 = fStack_1374;
                    fStack_136c = fStack_1374;
                    _local_12f8 = auVar219;
                    local_12a8 = fStack_129c;
                    fStack_12a4 = fStack_129c;
                    fStack_12a0 = fStack_129c;
                    local_1378 = fStack_1374;
                    if (*(long *)(pbVar28 + 0x10) == 0) {
                      puVar64 = *(undefined4 **)((long)&(pRVar47->super_RayK<1>).org.field_0 + 8);
                      if (*(long *)&(pSVar30->super_AccelN).super_Accel.super_AccelData.bounds.
                                    bounds1.upper.field_0 == 0) {
                        uVar55 = *(undefined4 *)(local_1248 + lVar50 * 4);
                        uVar17 = *(undefined4 *)(local_1238 + lVar50 * 4);
                        uVar18 = *(undefined4 *)(local_1218 + lVar50 * 4);
                        uVar19 = *(undefined4 *)(local_1208 + lVar50 * 4);
                        uVar20 = *(undefined4 *)(local_11f8 + lVar50 * 4);
                        *(undefined4 *)&(pIVar48->intersector1).intersect =
                             *(undefined4 *)(local_1228 + lVar50 * 4);
                        *(undefined4 *)&(pIVar48->intersector1).pointQuery = uVar18;
                        *(undefined4 *)((long)&(pIVar48->intersector1).pointQuery + 4) = uVar19;
                        *(undefined4 *)&(pIVar48->intersector1).name = uVar20;
                        *(undefined4 *)((long)&(pIVar48->intersector1).name + 4) = uVar55;
                        *(undefined4 *)&(pIVar48->intersector4).intersect = uVar17;
                        *(int *)((long)&(pIVar48->intersector4).intersect + 4) =
                             (int)local_1464._20_8_;
                        *(int *)&(pIVar48->intersector4).occluded = (int)local_1464._4_8_;
                        *(undefined4 *)((long)&(pIVar48->intersector4).occluded + 4) = *puVar64;
                        *(undefined4 *)&(pIVar48->intersector4).name = puVar64[1];
                        goto LAB_006b4715;
                      }
                    }
                    else {
                      puVar64 = *(undefined4 **)((long)&(pRVar47->super_RayK<1>).org.field_0 + 8);
                    }
LAB_006b5c04:
                    _local_1488 = auVar113;
                    local_135c = *(undefined4 *)(local_1248 + lVar50 * 4);
                    local_1358 = *(undefined4 *)(local_1238 + lVar50 * 4);
                    *(undefined4 *)&(pIVar48->intersector1).intersect =
                         *(undefined4 *)(local_1228 + lVar50 * 4);
                    local_1368 = *(float *)(local_1218 + lVar50 * 4);
                    local_1364 = *(undefined4 *)(local_1208 + lVar50 * 4);
                    local_1360 = *(undefined4 *)(local_11f8 + lVar50 * 4);
                    local_1354 = (int)local_1464._20_8_;
                    local_1350 = (int)local_1464._4_8_;
                    local_134c = *puVar64;
                    local_1348 = puVar64[1];
                    local_1464._0_4_ = 0xffffffff;
                    local_13e8[0] = (Intersectors *)local_1464;
                    local_13e8[1] =
                         (Intersectors *)
                         *(undefined8 *)
                          ((long)&(pSVar30->super_AccelN).super_Accel.super_AccelData.bounds.bounds0
                                  .lower + 8);
                    local_13d8 = puVar64;
                    local_13d0 = pIVar48;
                    local_13c8 = &local_1368;
                    local_13c0 = 1;
                    pcVar31 = *(code **)&(pSVar30->super_AccelN).super_Accel.super_AccelData.bounds.
                                         bounds1.upper.field_0;
                    local_1438 = fVar178;
                    if (pcVar31 == (code *)0x0) {
LAB_006b5d14:
                      if ((*(code **)(pbVar28 + 0x10) != (code *)0x0) &&
                         (((*pbVar28 & 2) != 0 ||
                          ((*(byte *)((long)&(pSVar30->super_AccelN).super_Accel.super_AccelData.
                                             bounds.bounds1.lower + 0xe) & 0x40) != 0)))) {
                        (**(code **)(pbVar28 + 0x10))(local_13e8);
                        auVar137 = _local_1488;
                        fVar178 = local_1438;
                        if (*(int *)&local_13e8[0]->ptr == 0) goto LAB_006b5da0;
                      }
                      *(float *)&(local_13d0->intersector1).pointQuery = *local_13c8;
                      *(float *)((long)&(local_13d0->intersector1).pointQuery + 4) = local_13c8[1];
                      *(float *)&(local_13d0->intersector1).name = local_13c8[2];
                      *(float *)((long)&(local_13d0->intersector1).name + 4) = local_13c8[3];
                      *(float *)&(local_13d0->intersector4).intersect = local_13c8[4];
                      *(float *)((long)&(local_13d0->intersector4).intersect + 4) = local_13c8[5];
                      *(float *)&(local_13d0->intersector4).occluded = local_13c8[6];
                      *(float *)((long)&(local_13d0->intersector4).occluded + 4) = local_13c8[7];
                      context = (RayQueryContext *)(ulong)(uint)local_13c8[8];
                      *(float *)&(local_13d0->intersector4).name = local_13c8[8];
                      pIVar53 = local_13d0;
                      fVar178 = local_1438;
                    }
                    else {
                      (*pcVar31)(local_13e8);
                      auVar137 = _local_1488;
                      fVar178 = local_1438;
                      if (*(int *)&local_13e8[0]->ptr != 0) goto LAB_006b5d14;
LAB_006b5da0:
                      *(undefined4 *)&(pIVar48->intersector1).intersect = local_1478._0_4_;
                      pIVar53 = local_13e8[0];
                      auVar137 = _local_1488;
                    }
                    *(undefined4 *)(local_1408 + lVar50 * 4) = 0;
                    local_1478 = (undefined1  [8])(pIVar48->intersector1).intersect;
                    unique0x00006c88 = (pIVar48->intersector1).occluded;
                    fVar102 = SUB84(local_1478,0);
                    auVar94._0_4_ = -(uint)(auVar137._0_4_ <= fVar102) & local_1408._0_4_;
                    auVar94._4_4_ = -(uint)(auVar137._4_4_ <= fVar102) & local_1408._4_4_;
                    auVar94._8_4_ = -(uint)(auVar137._8_4_ <= fVar102) & local_1408._8_4_;
                    auVar94._12_4_ = -(uint)(auVar137._12_4_ <= fVar102) & local_1408._12_4_;
                    local_1408 = auVar94;
                    iVar68 = movmskps((int)pIVar53,auVar94);
                    uVar59 = local_11c8;
                    pauVar62 = local_11a8;
                    uVar60 = local_11b8;
                    uVar63 = local_11c0;
                    uVar66 = local_1464._12_8_;
                    fVar102 = fStack_1030;
                    fVar222 = fStack_102c;
                    fVar218 = local_11e8;
                    fVar217 = fStack_11e4;
                    fVar101 = fStack_11e0;
                    fVar172 = fStack_11dc;
                    if (iVar68 != 0) {
                      auVar113 = blendvps(_DAT_01f45a30,auVar137,auVar94);
                      auVar154._4_4_ = auVar113._0_4_;
                      auVar154._0_4_ = auVar113._4_4_;
                      auVar154._8_4_ = auVar113._12_4_;
                      auVar154._12_4_ = auVar113._8_4_;
                      auVar219 = minps(auVar154,auVar113);
                      auVar120._0_8_ = auVar219._8_8_;
                      auVar120._8_4_ = auVar219._0_4_;
                      auVar120._12_4_ = auVar219._4_4_;
                      auVar219 = minps(auVar120,auVar219);
                      auVar121._0_8_ =
                           CONCAT44(-(uint)(auVar219._4_4_ == auVar113._4_4_) & auVar94._4_4_,
                                    -(uint)(auVar219._0_4_ == auVar113._0_4_) & auVar94._0_4_);
                      auVar121._8_4_ = -(uint)(auVar219._8_4_ == auVar113._8_4_) & auVar94._8_4_;
                      auVar121._12_4_ = -(uint)(auVar219._12_4_ == auVar113._12_4_) & auVar94._12_4_
                      ;
                      iVar68 = movmskps(iVar68,auVar121);
                      if (iVar68 != 0) {
                        auVar94._8_4_ = auVar121._8_4_;
                        auVar94._0_8_ = auVar121._0_8_;
                        auVar94._12_4_ = auVar121._12_4_;
                      }
                      uVar55 = movmskps(iVar68,auVar94);
                      uVar59 = CONCAT44((int)((ulong)pIVar53 >> 0x20),uVar55);
                      lVar50 = 0;
                      auVar113 = _local_1488;
                      if (uVar59 != 0) {
                        for (; (uVar59 >> lVar50 & 1) == 0; lVar50 = lVar50 + 1) {
                        }
                      }
                      goto LAB_006b5c04;
                    }
                  }
                }
              }
            }
            goto LAB_006b4715;
          }
          auVar219 = local_1138;
          auVar113 = local_1098;
          auVar176 = local_10a8;
          auVar232 = local_10b8;
          fVar223 = local_1148;
          fVar178 = fStack_1144;
          fVar193 = fStack_1140;
          fVar194 = fStack_113c;
          fVar227 = local_1158;
          fVar125 = fStack_1154;
          fVar195 = fStack_1150;
          fVar207 = fStack_114c;
          fVar224 = local_1168;
          fVar126 = fStack_1164;
          fVar182 = fStack_1160;
          fVar190 = fStack_115c;
          fVar226 = local_1178;
          fVar214 = fStack_1174;
          fVar170 = fStack_1170;
          fVar171 = fStack_116c;
        }
        local_1038 = *(float *)&(This->intersector1).intersect;
        fStack_1034 = local_1038;
        fVar102 = local_1038;
        fVar222 = local_1038;
        fVar215 = local_1038;
      }
      goto LAB_006b408e;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }